

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  byte bVar89;
  byte bVar90;
  uint uVar91;
  undefined1 (*pauVar92) [32];
  uint uVar93;
  uint uVar94;
  undefined4 uVar102;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  long lVar95;
  ulong uVar96;
  bool bVar97;
  int iVar98;
  ulong uVar99;
  bool bVar100;
  float fVar101;
  float fVar127;
  float fVar128;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar129;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar106 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar229 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined8 uVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar149;
  float fVar172;
  float fVar173;
  undefined1 auVar150 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar151 [16];
  float fVar174;
  undefined1 auVar162 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar171 [64];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar212;
  float fVar213;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar207 [32];
  float fVar215;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar247 [32];
  float fVar253;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar260;
  undefined1 in_ZMM10 [64];
  undefined1 auVar259 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar261 [64];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar262;
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar282;
  float fVar283;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_ae4;
  int local_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_900;
  undefined4 local_8f8;
  float local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  uint local_8e8;
  uint local_8e4;
  uint local_8e0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [28];
  uint uStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  uint uStack_604;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar263 [32];
  
  PVar9 = prim[1];
  uVar99 = (ulong)(byte)PVar9;
  lVar21 = uVar99 * 0x25;
  fVar197 = *(float *)(prim + lVar21 + 0x12);
  auVar113 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar150._0_4_ = fVar197 * (ray->dir).field_0.m128[0];
  auVar150._4_4_ = fVar197 * (ray->dir).field_0.m128[1];
  auVar150._8_4_ = fVar197 * (ray->dir).field_0.m128[2];
  auVar150._12_4_ = fVar197 * (ray->dir).field_0.m128[3];
  auVar103._0_4_ = fVar197 * auVar113._0_4_;
  auVar103._4_4_ = fVar197 * auVar113._4_4_;
  auVar103._8_4_ = fVar197 * auVar113._8_4_;
  auVar103._12_4_ = fVar197 * auVar113._12_4_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar99 * 4 + 6);
  auVar147 = vpmovsxbd_avx2(auVar113);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar99 * 5 + 6);
  auVar117 = vpmovsxbd_avx2(auVar108);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar99 * 6 + 6);
  auVar278 = vpmovsxbd_avx2(auVar271);
  auVar278 = vcvtdq2ps_avx(auVar278);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar99 * 0xf + 6);
  auVar266 = vpmovsxbd_avx2(auVar4);
  auVar266 = vcvtdq2ps_avx(auVar266);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar17 = vpmovsxbd_avx2(auVar246);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar99 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar99 * 0x1a + 6);
  auVar120 = vpmovsxbd_avx2(auVar6);
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar99 * 0x1b + 6);
  auVar240 = vpmovsxbd_avx2(auVar7);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar99 * 0x1c + 6);
  auVar229 = vpmovsxbd_avx2(auVar8);
  auVar240 = vcvtdq2ps_avx(auVar240);
  auVar229 = vcvtdq2ps_avx(auVar229);
  auVar232._4_4_ = auVar150._0_4_;
  auVar232._0_4_ = auVar150._0_4_;
  auVar232._8_4_ = auVar150._0_4_;
  auVar232._12_4_ = auVar150._0_4_;
  auVar232._16_4_ = auVar150._0_4_;
  auVar232._20_4_ = auVar150._0_4_;
  auVar232._24_4_ = auVar150._0_4_;
  auVar232._28_4_ = auVar150._0_4_;
  auVar113 = vmovshdup_avx(auVar150);
  uVar133 = auVar113._0_8_;
  auVar280._8_8_ = uVar133;
  auVar280._0_8_ = uVar133;
  auVar280._16_8_ = uVar133;
  auVar280._24_8_ = uVar133;
  auVar113 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar197 = auVar113._0_4_;
  auVar261._0_4_ = fVar197 * auVar278._0_4_;
  fVar212 = auVar113._4_4_;
  auVar261._4_4_ = fVar212 * auVar278._4_4_;
  auVar261._8_4_ = fVar197 * auVar278._8_4_;
  auVar261._12_4_ = fVar212 * auVar278._12_4_;
  auVar261._16_4_ = fVar197 * auVar278._16_4_;
  auVar261._20_4_ = fVar212 * auVar278._20_4_;
  auVar261._28_36_ = in_ZMM11._28_36_;
  auVar261._24_4_ = fVar197 * auVar278._24_4_;
  auVar259._0_4_ = auVar18._0_4_ * fVar197;
  auVar259._4_4_ = auVar18._4_4_ * fVar212;
  auVar259._8_4_ = auVar18._8_4_ * fVar197;
  auVar259._12_4_ = auVar18._12_4_ * fVar212;
  auVar259._16_4_ = auVar18._16_4_ * fVar197;
  auVar259._20_4_ = auVar18._20_4_ * fVar212;
  auVar259._28_36_ = in_ZMM10._28_36_;
  auVar259._24_4_ = auVar18._24_4_ * fVar197;
  auVar247._0_4_ = auVar229._0_4_ * fVar197;
  auVar247._4_4_ = auVar229._4_4_ * fVar212;
  auVar247._8_4_ = auVar229._8_4_ * fVar197;
  auVar247._12_4_ = auVar229._12_4_ * fVar212;
  auVar247._16_4_ = auVar229._16_4_ * fVar197;
  auVar247._20_4_ = auVar229._20_4_ * fVar212;
  auVar247._24_4_ = auVar229._24_4_ * fVar197;
  auVar247._28_4_ = 0;
  auVar113 = vfmadd231ps_fma(auVar261._0_32_,auVar280,auVar117);
  auVar108 = vfmadd231ps_fma(auVar259._0_32_,auVar280,auVar17);
  auVar271 = vfmadd231ps_fma(auVar247,auVar240,auVar280);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar232,auVar147);
  auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar232,auVar266);
  auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar120,auVar232);
  auVar233._4_4_ = auVar103._0_4_;
  auVar233._0_4_ = auVar103._0_4_;
  auVar233._8_4_ = auVar103._0_4_;
  auVar233._12_4_ = auVar103._0_4_;
  auVar233._16_4_ = auVar103._0_4_;
  auVar233._20_4_ = auVar103._0_4_;
  auVar233._24_4_ = auVar103._0_4_;
  auVar233._28_4_ = auVar103._0_4_;
  auVar113 = vmovshdup_avx(auVar103);
  uVar133 = auVar113._0_8_;
  auVar281._8_8_ = uVar133;
  auVar281._0_8_ = uVar133;
  auVar281._16_8_ = uVar133;
  auVar281._24_8_ = uVar133;
  auVar113 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar197 = auVar113._0_4_;
  auVar160._0_4_ = fVar197 * auVar278._0_4_;
  fVar212 = auVar113._4_4_;
  auVar160._4_4_ = fVar212 * auVar278._4_4_;
  auVar160._8_4_ = fVar197 * auVar278._8_4_;
  auVar160._12_4_ = fVar212 * auVar278._12_4_;
  auVar160._16_4_ = fVar197 * auVar278._16_4_;
  auVar160._20_4_ = fVar212 * auVar278._20_4_;
  auVar160._24_4_ = fVar197 * auVar278._24_4_;
  auVar160._28_4_ = 0;
  auVar16._4_4_ = auVar18._4_4_ * fVar212;
  auVar16._0_4_ = auVar18._0_4_ * fVar197;
  auVar16._8_4_ = auVar18._8_4_ * fVar197;
  auVar16._12_4_ = auVar18._12_4_ * fVar212;
  auVar16._16_4_ = auVar18._16_4_ * fVar197;
  auVar16._20_4_ = auVar18._20_4_ * fVar212;
  auVar16._24_4_ = auVar18._24_4_ * fVar197;
  auVar16._28_4_ = auVar278._28_4_;
  auVar278._4_4_ = auVar229._4_4_ * fVar212;
  auVar278._0_4_ = auVar229._0_4_ * fVar197;
  auVar278._8_4_ = auVar229._8_4_ * fVar197;
  auVar278._12_4_ = auVar229._12_4_ * fVar212;
  auVar278._16_4_ = auVar229._16_4_ * fVar197;
  auVar278._20_4_ = auVar229._20_4_ * fVar212;
  auVar278._24_4_ = auVar229._24_4_ * fVar197;
  auVar278._28_4_ = fVar212;
  auVar113 = vfmadd231ps_fma(auVar160,auVar281,auVar117);
  auVar246 = vfmadd231ps_fma(auVar16,auVar281,auVar17);
  auVar5 = vfmadd231ps_fma(auVar278,auVar281,auVar240);
  auVar103 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar233,auVar147);
  local_7c0._8_4_ = 0x7fffffff;
  local_7c0._0_8_ = 0x7fffffff7fffffff;
  local_7c0._12_4_ = 0x7fffffff;
  local_7c0._16_4_ = 0x7fffffff;
  local_7c0._20_4_ = 0x7fffffff;
  local_7c0._24_4_ = 0x7fffffff;
  local_7c0._28_4_ = 0x7fffffff;
  auVar272._8_4_ = 0x219392ef;
  auVar272._0_8_ = 0x219392ef219392ef;
  auVar272._12_4_ = 0x219392ef;
  auVar272._16_4_ = 0x219392ef;
  auVar272._20_4_ = 0x219392ef;
  auVar272._24_4_ = 0x219392ef;
  auVar272._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(ZEXT1632(auVar4),local_7c0);
  auVar147 = vcmpps_avx(auVar147,auVar272,1);
  auVar117 = vblendvps_avx(ZEXT1632(auVar4),auVar272,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar108),local_7c0);
  auVar147 = vcmpps_avx(auVar147,auVar272,1);
  auVar278 = vblendvps_avx(ZEXT1632(auVar108),auVar272,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar271),local_7c0);
  auVar147 = vcmpps_avx(auVar147,auVar272,1);
  auVar147 = vblendvps_avx(ZEXT1632(auVar271),auVar272,auVar147);
  auVar150 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar233,auVar266);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar233,auVar120);
  fVar197 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  auVar228._4_4_ = fVar197;
  auVar228._0_4_ = fVar197;
  auVar228._8_4_ = fVar197;
  auVar228._12_4_ = fVar197;
  auVar228._16_4_ = fVar197;
  auVar228._20_4_ = fVar197;
  auVar228._24_4_ = fVar197;
  auVar228._28_4_ = fVar197;
  auVar266 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 7 + 6));
  auVar266 = vcvtdq2ps_avx(auVar266);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xb + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 9 + 6));
  auVar4 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0xd + 6));
  auVar266 = vcvtdq2ps_avx(auVar18);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar246 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar266 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x12 + 6));
  auVar266 = vcvtdq2ps_avx(auVar266);
  uVar96 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 2 + uVar96 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar18 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 + 6));
  auVar5 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar266 = vcvtdq2ps_avx(auVar18);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x18 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar6 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar259 = ZEXT1664(auVar6);
  auVar266 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x1d + 6));
  auVar266 = vcvtdq2ps_avx(auVar266);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 + (ulong)(byte)PVar9 * 0x20 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar7 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar261 = ZEXT1664(auVar7);
  auVar266 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar9 * 0x20 - uVar99) + 6))
  ;
  auVar266 = vcvtdq2ps_avx(auVar266);
  auVar17 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar99 * 0x23 + 6));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar266);
  auVar8 = vfmadd213ps_fma(auVar17,auVar228,auVar266);
  auVar266 = vrcpps_avx(auVar117);
  auVar263._8_4_ = 0x3f800000;
  auVar263._0_8_ = 0x3f8000003f800000;
  auVar263._12_4_ = 0x3f800000;
  auVar263._16_4_ = 0x3f800000;
  auVar263._20_4_ = 0x3f800000;
  auVar263._24_4_ = 0x3f800000;
  auVar263._28_4_ = 0x3f800000;
  auVar270 = ZEXT3264(auVar263);
  auVar113 = vfnmadd213ps_fma(auVar117,auVar266,auVar263);
  auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar266,auVar266);
  auVar117 = vrcpps_avx(auVar278);
  auVar108 = vfnmadd213ps_fma(auVar278,auVar117,auVar263);
  auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar117,auVar117);
  auVar117 = vrcpps_avx(auVar147);
  auVar271 = vfnmadd213ps_fma(auVar147,auVar117,auVar263);
  auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar117,auVar117);
  auVar147 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar103));
  auVar117 = vsubps_avx(ZEXT1632(auVar246),ZEXT1632(auVar103));
  auVar266._4_4_ = auVar113._4_4_ * auVar147._4_4_;
  auVar266._0_4_ = auVar113._0_4_ * auVar147._0_4_;
  auVar266._8_4_ = auVar113._8_4_ * auVar147._8_4_;
  auVar266._12_4_ = auVar113._12_4_ * auVar147._12_4_;
  auVar266._16_4_ = auVar147._16_4_ * 0.0;
  auVar266._20_4_ = auVar147._20_4_ * 0.0;
  auVar266._24_4_ = auVar147._24_4_ * 0.0;
  auVar266._28_4_ = auVar147._28_4_;
  auVar17._4_4_ = auVar113._4_4_ * auVar117._4_4_;
  auVar17._0_4_ = auVar113._0_4_ * auVar117._0_4_;
  auVar17._8_4_ = auVar113._8_4_ * auVar117._8_4_;
  auVar17._12_4_ = auVar113._12_4_ * auVar117._12_4_;
  auVar17._16_4_ = auVar117._16_4_ * 0.0;
  auVar17._20_4_ = auVar117._20_4_ * 0.0;
  auVar17._24_4_ = auVar117._24_4_ * 0.0;
  auVar17._28_4_ = auVar117._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar150));
  auVar117 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar150));
  auVar18._4_4_ = auVar108._4_4_ * auVar147._4_4_;
  auVar18._0_4_ = auVar108._0_4_ * auVar147._0_4_;
  auVar18._8_4_ = auVar108._8_4_ * auVar147._8_4_;
  auVar18._12_4_ = auVar108._12_4_ * auVar147._12_4_;
  auVar18._16_4_ = auVar147._16_4_ * 0.0;
  auVar18._20_4_ = auVar147._20_4_ * 0.0;
  auVar18._24_4_ = auVar147._24_4_ * 0.0;
  auVar18._28_4_ = auVar147._28_4_;
  auVar120._4_4_ = auVar108._4_4_ * auVar117._4_4_;
  auVar120._0_4_ = auVar108._0_4_ * auVar117._0_4_;
  auVar120._8_4_ = auVar108._8_4_ * auVar117._8_4_;
  auVar120._12_4_ = auVar108._12_4_ * auVar117._12_4_;
  auVar120._16_4_ = auVar117._16_4_ * 0.0;
  auVar120._20_4_ = auVar117._20_4_ * 0.0;
  auVar120._24_4_ = auVar117._24_4_ * 0.0;
  auVar120._28_4_ = auVar117._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar104));
  auVar240._4_4_ = auVar271._4_4_ * auVar147._4_4_;
  auVar240._0_4_ = auVar271._0_4_ * auVar147._0_4_;
  auVar240._8_4_ = auVar271._8_4_ * auVar147._8_4_;
  auVar240._12_4_ = auVar271._12_4_ * auVar147._12_4_;
  auVar240._16_4_ = auVar147._16_4_ * 0.0;
  auVar240._20_4_ = auVar147._20_4_ * 0.0;
  auVar240._24_4_ = auVar147._24_4_ * 0.0;
  auVar240._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar104));
  auVar229._4_4_ = auVar271._4_4_ * auVar147._4_4_;
  auVar229._0_4_ = auVar271._0_4_ * auVar147._0_4_;
  auVar229._8_4_ = auVar271._8_4_ * auVar147._8_4_;
  auVar229._12_4_ = auVar271._12_4_ * auVar147._12_4_;
  auVar229._16_4_ = auVar147._16_4_ * 0.0;
  auVar229._20_4_ = auVar147._20_4_ * 0.0;
  auVar229._24_4_ = auVar147._24_4_ * 0.0;
  auVar229._28_4_ = auVar147._28_4_;
  auVar147 = vpminsd_avx2(auVar266,auVar17);
  auVar117 = vpminsd_avx2(auVar18,auVar120);
  auVar147 = vmaxps_avx(auVar147,auVar117);
  auVar117 = vpminsd_avx2(auVar240,auVar229);
  uVar102 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar210._4_4_ = uVar102;
  auVar210._0_4_ = uVar102;
  auVar210._8_4_ = uVar102;
  auVar210._12_4_ = uVar102;
  auVar210._16_4_ = uVar102;
  auVar210._20_4_ = uVar102;
  auVar210._24_4_ = uVar102;
  auVar210._28_4_ = uVar102;
  auVar117 = vmaxps_avx(auVar117,auVar210);
  auVar147 = vmaxps_avx(auVar147,auVar117);
  local_2e0._4_4_ = auVar147._4_4_ * 0.99999964;
  local_2e0._0_4_ = auVar147._0_4_ * 0.99999964;
  local_2e0._8_4_ = auVar147._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar147._12_4_ * 0.99999964;
  local_2e0._16_4_ = auVar147._16_4_ * 0.99999964;
  local_2e0._20_4_ = auVar147._20_4_ * 0.99999964;
  local_2e0._24_4_ = auVar147._24_4_ * 0.99999964;
  local_2e0._28_4_ = auVar147._28_4_;
  auVar147 = vpmaxsd_avx2(auVar266,auVar17);
  auVar117 = vpmaxsd_avx2(auVar18,auVar120);
  auVar147 = vminps_avx(auVar147,auVar117);
  auVar117 = vpmaxsd_avx2(auVar240,auVar229);
  fVar197 = ray->tfar;
  auVar161._4_4_ = fVar197;
  auVar161._0_4_ = fVar197;
  auVar161._8_4_ = fVar197;
  auVar161._12_4_ = fVar197;
  auVar161._16_4_ = fVar197;
  auVar161._20_4_ = fVar197;
  auVar161._24_4_ = fVar197;
  auVar161._28_4_ = fVar197;
  auVar117 = vminps_avx(auVar117,auVar161);
  auVar147 = vminps_avx(auVar147,auVar117);
  auVar19._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar19._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar19._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar19._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar19._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar19._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar19._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar19._28_4_ = auVar147._28_4_;
  auVar147._1_3_ = 0;
  auVar147[0] = PVar9;
  auVar147[4] = PVar9;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar9;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar9;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar9;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar9;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar9;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar9;
  auVar147._29_3_ = 0;
  auVar117 = vpcmpgtd_avx2(auVar147,_DAT_01fe9900);
  auVar147 = vcmpps_avx(local_2e0,auVar19,2);
  auVar147 = vandps_avx(auVar147,auVar117);
  uVar91 = vmovmskps_avx(auVar147);
  if (uVar91 == 0) {
    return false;
  }
  uVar91 = uVar91 & 0xff;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  local_620 = 0x80000000;
  uStack_61c = 0x80000000;
  uStack_618 = 0x80000000;
  uStack_614 = 0x80000000;
  fStack_610 = -0.0;
  fStack_60c = -0.0;
  fStack_608 = -0.0;
  uStack_604 = 0x80000000;
  local_7d0 = prim;
LAB_01896d20:
  lVar21 = 0;
  local_7c8 = (ulong)uVar91;
  for (uVar99 = local_7c8; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar91 = *(uint *)(local_7d0 + 2);
  local_8c8 = (ulong)*(uint *)(local_7d0 + lVar21 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar91].ptr;
  uVar99 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           local_8c8 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar197 = (pGVar10->time_range).lower;
  fVar197 = pGVar10->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar197) / ((pGVar10->time_range).upper - fVar197));
  auVar113 = vroundss_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar197),9);
  auVar113 = vminss_avx(auVar113,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar113 = vmaxss_avx(ZEXT816(0) << 0x20,auVar113);
  fVar197 = fVar197 - auVar113._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar95 = (long)(int)auVar113._0_4_ * 0x38;
  lVar21 = *(long *)(_Var11 + 0x10 + lVar95);
  lVar12 = *(long *)(_Var11 + 0x38 + lVar95);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar95);
  pfVar1 = (float *)(lVar12 + uVar99 * lVar13);
  auVar134._0_4_ = fVar197 * *pfVar1;
  auVar134._4_4_ = fVar197 * pfVar1[1];
  auVar134._8_4_ = fVar197 * pfVar1[2];
  auVar134._12_4_ = fVar197 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar99 + 1) * lVar13);
  auVar151._0_4_ = fVar197 * *pfVar1;
  auVar151._4_4_ = fVar197 * pfVar1[1];
  auVar151._8_4_ = fVar197 * pfVar1[2];
  auVar151._12_4_ = fVar197 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + (uVar99 + 2) * lVar13);
  auVar198._0_4_ = fVar197 * *pfVar1;
  auVar198._4_4_ = fVar197 * pfVar1[1];
  auVar198._8_4_ = fVar197 * pfVar1[2];
  auVar198._12_4_ = fVar197 * pfVar1[3];
  pfVar1 = (float *)(lVar12 + lVar13 * (uVar99 + 3));
  auVar175._0_4_ = fVar197 * *pfVar1;
  auVar175._4_4_ = fVar197 * pfVar1[1];
  auVar175._8_4_ = fVar197 * pfVar1[2];
  auVar175._12_4_ = fVar197 * pfVar1[3];
  lVar12 = *(long *)(_Var11 + lVar95);
  fVar197 = 1.0 - fVar197;
  auVar104._4_4_ = fVar197;
  auVar104._0_4_ = fVar197;
  auVar104._8_4_ = fVar197;
  auVar104._12_4_ = fVar197;
  auVar4 = vfmadd231ps_fma(auVar134,auVar104,*(undefined1 (*) [16])(lVar12 + lVar21 * uVar99));
  auVar246 = vfmadd231ps_fma(auVar151,auVar104,
                             *(undefined1 (*) [16])(lVar12 + lVar21 * (uVar99 + 1)));
  auVar5 = vfmadd231ps_fma(auVar198,auVar104,*(undefined1 (*) [16])(lVar12 + lVar21 * (uVar99 + 2)))
  ;
  auVar6 = vfmadd231ps_fma(auVar175,auVar104,*(undefined1 (*) [16])(lVar12 + lVar21 * (uVar99 + 3)))
  ;
  auVar219._0_4_ = (auVar4._0_4_ + auVar246._0_4_ + auVar5._0_4_ + auVar6._0_4_) * 0.25;
  auVar219._4_4_ = (auVar4._4_4_ + auVar246._4_4_ + auVar5._4_4_ + auVar6._4_4_) * 0.25;
  auVar219._8_4_ = (auVar4._8_4_ + auVar246._8_4_ + auVar5._8_4_ + auVar6._8_4_) * 0.25;
  auVar219._12_4_ = (auVar4._12_4_ + auVar246._12_4_ + auVar5._12_4_ + auVar6._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar113 = vsubps_avx(auVar219,(undefined1  [16])aVar2);
  auVar113 = vdpps_avx(auVar113,(undefined1  [16])aVar3,0x7f);
  auVar108 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar271 = vrcpss_avx(auVar108,auVar108);
  auVar108 = vfnmadd213ss_fma(auVar271,auVar108,ZEXT416(0x40000000));
  auVar250 = ZEXT1664(auVar108);
  fVar197 = auVar271._0_4_ * auVar108._0_4_;
  auVar231 = ZEXT464((uint)fVar197);
  fVar197 = auVar113._0_4_ * fVar197;
  local_7e0 = ZEXT416((uint)fVar197);
  auVar220._4_4_ = fVar197;
  auVar220._0_4_ = fVar197;
  auVar220._8_4_ = fVar197;
  auVar220._12_4_ = fVar197;
  fStack_a90 = fVar197;
  _local_aa0 = auVar220;
  fStack_a8c = fVar197;
  fStack_a88 = fVar197;
  fStack_a84 = fVar197;
  auVar113 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar220);
  auVar113 = vblendps_avx(auVar113,_DAT_01f7aa10,8);
  local_9c0 = vsubps_avx(auVar4,auVar113);
  local_9d0 = vsubps_avx(auVar5,auVar113);
  local_9e0 = vsubps_avx(auVar246,auVar113);
  _local_9f0 = vsubps_avx(auVar6,auVar113);
  auVar113 = vmovshdup_avx(local_9c0);
  local_1e0 = auVar113._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar113 = vshufps_avx(local_9c0,local_9c0,0xaa);
  local_340 = auVar113._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar113 = vshufps_avx(local_9c0,local_9c0,0xff);
  local_360 = auVar113._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar113 = vmovshdup_avx(local_9e0);
  local_380 = auVar113._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar113 = vshufps_avx(local_9e0,local_9e0,0xaa);
  local_200 = auVar113._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar113 = vshufps_avx(local_9e0,local_9e0,0xff);
  local_220 = auVar113._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar113 = vmovshdup_avx(local_9d0);
  uVar133 = auVar113._0_8_;
  local_460._8_8_ = uVar133;
  local_460._0_8_ = uVar133;
  local_460._16_8_ = uVar133;
  local_460._24_8_ = uVar133;
  auVar113 = vshufps_avx(local_9d0,local_9d0,0xaa);
  local_240 = auVar113._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar113 = vshufps_avx(local_9d0,local_9d0,0xff);
  local_260 = auVar113._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar113 = vmovshdup_avx(_local_9f0);
  local_3a0 = auVar113._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar113 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  local_3c0 = auVar113._0_8_;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  auVar113 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  local_3e0 = auVar113._0_8_;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  auVar105._0_4_ = aVar3.x * aVar3.x;
  auVar105._4_4_ = aVar3.y * aVar3.y;
  auVar105._8_4_ = aVar3.z * aVar3.z;
  auVar105._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar113 = vshufps_avx(auVar105,auVar105,0xaa);
  uVar102 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_7a0._4_4_ = uVar102;
  local_7a0._0_4_ = uVar102;
  fStack_798 = (float)uVar102;
  fStack_794 = (float)uVar102;
  fStack_790 = (float)uVar102;
  fStack_78c = (float)uVar102;
  fStack_788 = (float)uVar102;
  register0x0000125c = uVar102;
  auVar118._0_8_ = auVar113._0_8_;
  auVar118._8_8_ = auVar118._0_8_;
  auVar118._16_8_ = auVar118._0_8_;
  auVar118._24_8_ = auVar118._0_8_;
  auVar113 = vfmadd231ps_fma(auVar118,_local_7a0,_local_7a0);
  uVar102 = *(undefined4 *)&(ray->dir).field_0;
  local_560._4_4_ = uVar102;
  local_560._0_4_ = uVar102;
  fStack_558 = (float)uVar102;
  fStack_554 = (float)uVar102;
  fStack_550 = (float)uVar102;
  fStack_54c = (float)uVar102;
  fStack_548 = (float)uVar102;
  register0x0000125c = uVar102;
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),_local_560,_local_560);
  local_ae4 = 1;
  uVar99 = 0;
  bVar97 = false;
  local_600 = (ray->dir).field_0.m128[2];
  local_400 = local_9c0._0_4_;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_2a0 = local_9e0._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_420 = local_9d0._0_4_;
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  local_440 = local_9f0._0_4_;
  fStack_43c = local_440;
  fStack_438 = local_440;
  fStack_434 = local_440;
  fStack_430 = local_440;
  fStack_42c = local_440;
  fStack_428 = local_440;
  fStack_424 = local_440;
  local_280 = ZEXT1632(auVar113);
  local_480 = vandps_avx(ZEXT1632(auVar113),local_7c0);
  local_510 = ZEXT816(0x3f80000000000000);
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  do {
    auVar190._8_4_ = 0x3f800000;
    auVar190._0_8_ = 0x3f8000003f800000;
    auVar190._12_4_ = 0x3f800000;
    auVar190._16_4_ = 0x3f800000;
    auVar190._20_4_ = 0x3f800000;
    iVar98 = (int)uVar99;
    auVar190._24_4_ = 0x3f800000;
    auVar190._28_4_ = 0x3f800000;
    auVar113 = vmovshdup_avx(local_510);
    auVar113 = vsubps_avx(auVar113,local_510);
    local_800._0_4_ = auVar113._0_4_;
    fVar262 = (float)local_800._0_4_ * 0.04761905;
    uVar102 = local_510._0_4_;
    local_780._4_4_ = uVar102;
    local_780._0_4_ = uVar102;
    local_780._8_4_ = uVar102;
    local_780._12_4_ = uVar102;
    local_780._16_4_ = uVar102;
    local_780._20_4_ = uVar102;
    local_780._24_4_ = uVar102;
    local_780._28_4_ = uVar102;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    auVar113 = vfmadd231ps_fma(local_780,local_800,_DAT_01faff20);
    auVar147 = vsubps_avx(auVar190,ZEXT1632(auVar113));
    fVar197 = auVar147._0_4_;
    fVar213 = auVar147._4_4_;
    fVar279 = auVar147._8_4_;
    fVar283 = auVar147._12_4_;
    fVar216 = auVar147._16_4_;
    fVar217 = auVar147._20_4_;
    fVar218 = auVar147._24_4_;
    fVar101 = fVar197 * fVar197 * fVar197;
    fVar127 = fVar213 * fVar213 * fVar213;
    fVar128 = fVar279 * fVar279 * fVar279;
    fVar129 = fVar283 * fVar283 * fVar283;
    fVar130 = fVar216 * fVar216 * fVar216;
    fVar131 = fVar217 * fVar217 * fVar217;
    fVar132 = fVar218 * fVar218 * fVar218;
    fVar212 = auVar113._0_4_;
    fVar214 = auVar113._4_4_;
    fVar282 = auVar113._8_4_;
    fVar215 = auVar113._12_4_;
    fVar149 = fVar212 * fVar212 * fVar212;
    fVar172 = fVar214 * fVar214 * fVar214;
    fVar173 = fVar282 * fVar282 * fVar282;
    fVar174 = fVar215 * fVar215 * fVar215;
    fVar244 = fVar197 * fVar212;
    fVar251 = fVar213 * fVar214;
    fVar252 = fVar279 * fVar282;
    fVar253 = fVar283 * fVar215;
    fVar254 = fVar216 * 0.0;
    fVar255 = fVar217 * 0.0;
    fVar256 = fVar218 * 0.0;
    fVar260 = auVar259._28_4_ + auVar270._28_4_;
    auVar22._4_4_ = fVar127 * 0.16666667;
    auVar22._0_4_ = fVar101 * 0.16666667;
    auVar22._8_4_ = fVar128 * 0.16666667;
    auVar22._12_4_ = fVar129 * 0.16666667;
    auVar22._16_4_ = fVar130 * 0.16666667;
    auVar22._20_4_ = fVar131 * 0.16666667;
    auVar22._24_4_ = fVar132 * 0.16666667;
    auVar22._28_4_ = fVar260 + (float)local_800._0_4_;
    auVar23._4_4_ =
         (fVar213 * fVar251 * 12.0 + fVar251 * fVar214 * 6.0 + fVar172 + fVar127 * 4.0) * 0.16666667
    ;
    auVar23._0_4_ =
         (fVar197 * fVar244 * 12.0 + fVar244 * fVar212 * 6.0 + fVar149 + fVar101 * 4.0) * 0.16666667
    ;
    auVar23._8_4_ =
         (fVar279 * fVar252 * 12.0 + fVar252 * fVar282 * 6.0 + fVar173 + fVar128 * 4.0) * 0.16666667
    ;
    auVar23._12_4_ =
         (fVar283 * fVar253 * 12.0 + fVar253 * fVar215 * 6.0 + fVar174 + fVar129 * 4.0) * 0.16666667
    ;
    auVar23._16_4_ =
         (fVar216 * fVar254 * 12.0 + fVar254 * 0.0 * 6.0 + fVar130 * 4.0 + 0.0) * 0.16666667;
    auVar23._20_4_ =
         (fVar217 * fVar255 * 12.0 + fVar255 * 0.0 * 6.0 + fVar131 * 4.0 + 0.0) * 0.16666667;
    auVar23._24_4_ =
         (fVar218 * fVar256 * 12.0 + fVar256 * 0.0 * 6.0 + fVar132 * 4.0 + 0.0) * 0.16666667;
    auVar23._28_4_ = auVar261._28_4_;
    auVar24._4_4_ =
         (fVar172 * 4.0 + fVar127 + fVar251 * fVar214 * 12.0 + fVar213 * fVar251 * 6.0) * 0.16666667
    ;
    auVar24._0_4_ =
         (fVar149 * 4.0 + fVar101 + fVar244 * fVar212 * 12.0 + fVar197 * fVar244 * 6.0) * 0.16666667
    ;
    auVar24._8_4_ =
         (fVar173 * 4.0 + fVar128 + fVar252 * fVar282 * 12.0 + fVar279 * fVar252 * 6.0) * 0.16666667
    ;
    auVar24._12_4_ =
         (fVar174 * 4.0 + fVar129 + fVar253 * fVar215 * 12.0 + fVar283 * fVar253 * 6.0) * 0.16666667
    ;
    auVar24._16_4_ = (fVar130 + 0.0 + fVar254 * 0.0 * 12.0 + fVar216 * fVar254 * 6.0) * 0.16666667;
    auVar24._20_4_ = (fVar131 + 0.0 + fVar255 * 0.0 * 12.0 + fVar217 * fVar255 * 6.0) * 0.16666667;
    auVar24._24_4_ = (fVar132 + 0.0 + fVar256 * 0.0 * 12.0 + fVar218 * fVar256 * 6.0) * 0.16666667;
    auVar24._28_4_ = auVar270._28_4_;
    fVar149 = fVar149 * 0.16666667;
    fVar172 = fVar172 * 0.16666667;
    fVar173 = fVar173 * 0.16666667;
    fVar174 = fVar174 * 0.16666667;
    auVar25._4_4_ = fVar172 * fStack_43c;
    auVar25._0_4_ = fVar149 * local_440;
    auVar25._8_4_ = fVar173 * fStack_438;
    auVar25._12_4_ = fVar174 * fStack_434;
    auVar25._16_4_ = fStack_430 * 0.0;
    auVar25._20_4_ = fStack_42c * 0.0;
    auVar25._24_4_ = fStack_428 * 0.0;
    auVar25._28_4_ = local_800._0_4_;
    auVar26._4_4_ = fVar172 * local_3a0._4_4_;
    auVar26._0_4_ = fVar149 * (float)local_3a0;
    auVar26._8_4_ = fVar173 * (float)uStack_398;
    auVar26._12_4_ = fVar174 * uStack_398._4_4_;
    auVar26._16_4_ = (float)uStack_390 * 0.0;
    auVar26._20_4_ = uStack_390._4_4_ * 0.0;
    auVar26._24_4_ = (float)uStack_388 * 0.0;
    auVar26._28_4_ = fVar260 + DAT_01faff20._28_4_ + 0.0;
    auVar27._4_4_ = fVar172 * local_3c0._4_4_;
    auVar27._0_4_ = fVar149 * (float)local_3c0;
    auVar27._8_4_ = fVar173 * (float)uStack_3b8;
    auVar27._12_4_ = fVar174 * uStack_3b8._4_4_;
    auVar27._16_4_ = (float)uStack_3b0 * 0.0;
    auVar27._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_3a8 * 0.0;
    auVar27._28_4_ = 0;
    auVar28._4_4_ = fVar172 * local_3e0._4_4_;
    auVar28._0_4_ = fVar149 * (float)local_3e0;
    auVar28._8_4_ = fVar173 * (float)uStack_3d8;
    auVar28._12_4_ = fVar174 * uStack_3d8._4_4_;
    auVar28._16_4_ = (float)uStack_3d0 * 0.0;
    auVar28._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar28._24_4_ = (float)uStack_3c8 * 0.0;
    auVar28._28_4_ = 0x40c00000;
    auVar72._4_4_ = uStack_41c;
    auVar72._0_4_ = local_420;
    auVar72._8_4_ = uStack_418;
    auVar72._12_4_ = uStack_414;
    auVar72._16_4_ = uStack_410;
    auVar72._20_4_ = uStack_40c;
    auVar72._24_4_ = uStack_408;
    auVar72._28_4_ = uStack_404;
    auVar113 = vfmadd231ps_fma(auVar25,auVar24,auVar72);
    auVar108 = vfmadd231ps_fma(auVar26,auVar24,local_460);
    auVar84._8_8_ = uStack_238;
    auVar84._0_8_ = local_240;
    auVar84._16_8_ = uStack_230;
    auVar84._24_8_ = uStack_228;
    auVar271 = vfmadd231ps_fma(auVar27,auVar24,auVar84);
    auVar83._8_8_ = uStack_258;
    auVar83._0_8_ = local_260;
    auVar83._16_8_ = uStack_250;
    auVar83._24_8_ = uStack_248;
    auVar4 = vfmadd231ps_fma(auVar28,auVar83,auVar24);
    auVar82._4_4_ = uStack_29c;
    auVar82._0_4_ = local_2a0;
    auVar82._8_4_ = uStack_298;
    auVar82._12_4_ = uStack_294;
    auVar82._16_4_ = uStack_290;
    auVar82._20_4_ = uStack_28c;
    auVar82._24_4_ = uStack_288;
    auVar82._28_4_ = uStack_284;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar23,auVar82);
    auVar76._8_8_ = uStack_378;
    auVar76._0_8_ = local_380;
    auVar76._16_8_ = uStack_370;
    auVar76._24_8_ = uStack_368;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar23,auVar76);
    auVar86._8_8_ = uStack_1f8;
    auVar86._0_8_ = local_200;
    auVar86._16_8_ = uStack_1f0;
    auVar86._24_8_ = uStack_1e8;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar23,auVar86);
    auVar85._8_8_ = uStack_218;
    auVar85._0_8_ = local_220;
    auVar85._16_8_ = uStack_210;
    auVar85._24_8_ = uStack_208;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar85,auVar23);
    auVar74._4_4_ = uStack_3fc;
    auVar74._0_4_ = local_400;
    auVar74._8_4_ = uStack_3f8;
    auVar74._12_4_ = uStack_3f4;
    auVar74._16_4_ = uStack_3f0;
    auVar74._20_4_ = uStack_3ec;
    auVar74._24_4_ = uStack_3e8;
    auVar74._28_4_ = uStack_3e4;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar22,auVar74);
    auVar161 = ZEXT1632(auVar113);
    auVar87._8_8_ = uStack_1d8;
    auVar87._0_8_ = local_1e0;
    auVar87._16_8_ = uStack_1d0;
    auVar87._24_8_ = uStack_1c8;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar22,auVar87);
    local_820 = ZEXT1632(auVar113);
    auVar80._8_8_ = uStack_338;
    auVar80._0_8_ = local_340;
    auVar80._16_8_ = uStack_330;
    auVar80._24_8_ = uStack_328;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar22,auVar80);
    auVar78._8_8_ = uStack_358;
    auVar78._0_8_ = local_360;
    auVar78._16_8_ = uStack_350;
    auVar78._24_8_ = uStack_348;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar22,auVar78);
    auVar227._0_4_ = (float)((uint)fVar212 ^ local_620) * fVar212;
    auVar227._4_4_ = (float)((uint)fVar214 ^ uStack_61c) * fVar214;
    auVar227._8_4_ = (float)((uint)fVar282 ^ uStack_618) * fVar282;
    auVar227._12_4_ = (float)((uint)fVar215 ^ uStack_614) * fVar215;
    auVar227._16_4_ = fStack_610 * 0.0;
    auVar227._20_4_ = fStack_60c * 0.0;
    auVar227._24_4_ = fStack_608 * 0.0;
    auVar227._28_4_ = 0;
    auVar29._4_4_ = fVar251 * 4.0;
    auVar29._0_4_ = fVar244 * 4.0;
    auVar29._8_4_ = fVar252 * 4.0;
    auVar29._12_4_ = fVar253 * 4.0;
    auVar29._16_4_ = fVar254 * 4.0;
    auVar29._20_4_ = fVar255 * 4.0;
    fVar101 = auVar250._28_4_;
    auVar29._24_4_ = fVar256 * 4.0;
    auVar29._28_4_ = fVar101;
    auVar117 = vsubps_avx(auVar227,auVar29);
    auVar30._4_4_ = fVar213 * (float)((uint)fVar213 ^ uStack_61c) * 0.5;
    auVar30._0_4_ = fVar197 * (float)((uint)fVar197 ^ local_620) * 0.5;
    auVar30._8_4_ = fVar279 * (float)((uint)fVar279 ^ uStack_618) * 0.5;
    auVar30._12_4_ = fVar283 * (float)((uint)fVar283 ^ uStack_614) * 0.5;
    auVar30._16_4_ = fVar216 * (float)((uint)fVar216 ^ (uint)fStack_610) * 0.5;
    auVar30._20_4_ = fVar217 * (float)((uint)fVar217 ^ (uint)fStack_60c) * 0.5;
    auVar30._24_4_ = fVar218 * (float)((uint)fVar218 ^ (uint)fStack_608) * 0.5;
    auVar30._28_4_ = auVar147._28_4_;
    auVar31._4_4_ = auVar117._4_4_ * 0.5;
    auVar31._0_4_ = auVar117._0_4_ * 0.5;
    auVar31._8_4_ = auVar117._8_4_ * 0.5;
    auVar31._12_4_ = auVar117._12_4_ * 0.5;
    auVar31._16_4_ = auVar117._16_4_ * 0.5;
    auVar31._20_4_ = auVar117._20_4_ * 0.5;
    auVar31._24_4_ = auVar117._24_4_ * 0.5;
    auVar31._28_4_ = auVar117._28_4_;
    auVar32._4_4_ = (fVar251 * 4.0 + fVar213 * fVar213) * 0.5;
    auVar32._0_4_ = (fVar244 * 4.0 + fVar197 * fVar197) * 0.5;
    auVar32._8_4_ = (fVar252 * 4.0 + fVar279 * fVar279) * 0.5;
    auVar32._12_4_ = (fVar253 * 4.0 + fVar283 * fVar283) * 0.5;
    auVar32._16_4_ = (fVar254 * 4.0 + fVar216 * fVar216) * 0.5;
    auVar32._20_4_ = (fVar255 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar32._24_4_ = (fVar256 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar32._28_4_ = fVar101 + auVar231._28_4_;
    fVar197 = fVar212 * fVar212 * 0.5;
    fVar212 = fVar214 * fVar214 * 0.5;
    fVar213 = fVar282 * fVar282 * 0.5;
    fVar214 = fVar215 * fVar215 * 0.5;
    auVar33._4_4_ = fVar212 * fStack_43c;
    auVar33._0_4_ = fVar197 * local_440;
    auVar33._8_4_ = fVar213 * fStack_438;
    auVar33._12_4_ = fVar214 * fStack_434;
    auVar33._16_4_ = fStack_430 * 0.0;
    auVar33._20_4_ = fStack_42c * 0.0;
    auVar33._24_4_ = fStack_428 * 0.0;
    auVar33._28_4_ = fVar101;
    auVar34._4_4_ = fVar212 * local_3a0._4_4_;
    auVar34._0_4_ = fVar197 * (float)local_3a0;
    auVar34._8_4_ = fVar213 * (float)uStack_398;
    auVar34._12_4_ = fVar214 * uStack_398._4_4_;
    auVar34._16_4_ = (float)uStack_390 * 0.0;
    auVar34._20_4_ = uStack_390._4_4_ * 0.0;
    auVar34._24_4_ = (float)uStack_388 * 0.0;
    auVar34._28_4_ = uStack_604;
    auVar35._4_4_ = fVar212 * local_3c0._4_4_;
    auVar35._0_4_ = fVar197 * (float)local_3c0;
    auVar35._8_4_ = fVar213 * (float)uStack_3b8;
    auVar35._12_4_ = fVar214 * uStack_3b8._4_4_;
    auVar35._16_4_ = (float)uStack_3b0 * 0.0;
    auVar35._20_4_ = uStack_3b0._4_4_ * 0.0;
    auVar35._24_4_ = (float)uStack_3a8 * 0.0;
    auVar35._28_4_ = auVar261._28_4_;
    auVar36._4_4_ = fVar212 * local_3e0._4_4_;
    auVar36._0_4_ = fVar197 * (float)local_3e0;
    auVar36._8_4_ = fVar213 * (float)uStack_3d8;
    auVar36._12_4_ = fVar214 * uStack_3d8._4_4_;
    auVar36._16_4_ = (float)uStack_3d0 * 0.0;
    auVar36._20_4_ = uStack_3d0._4_4_ * 0.0;
    auVar36._24_4_ = (float)uStack_3c8 * 0.0;
    auVar36._28_4_ = 0;
    auVar73._4_4_ = uStack_41c;
    auVar73._0_4_ = local_420;
    auVar73._8_4_ = uStack_418;
    auVar73._12_4_ = uStack_414;
    auVar73._16_4_ = uStack_410;
    auVar73._20_4_ = uStack_40c;
    auVar73._24_4_ = uStack_408;
    auVar73._28_4_ = uStack_404;
    auVar271 = vfmadd231ps_fma(auVar33,auVar32,auVar73);
    auVar4 = vfmadd231ps_fma(auVar34,auVar32,local_460);
    auVar246 = vfmadd231ps_fma(auVar35,auVar32,auVar84);
    auVar5 = vfmadd231ps_fma(auVar36,auVar83,auVar32);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar31,auVar82);
    auVar77._8_8_ = uStack_378;
    auVar77._0_8_ = local_380;
    auVar77._16_8_ = uStack_370;
    auVar77._24_8_ = uStack_368;
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar31,auVar77);
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar31,auVar86);
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar85,auVar31);
    auVar75._4_4_ = uStack_3fc;
    auVar75._0_4_ = local_400;
    auVar75._8_4_ = uStack_3f8;
    auVar75._12_4_ = uStack_3f4;
    auVar75._16_4_ = uStack_3f0;
    auVar75._20_4_ = uStack_3ec;
    auVar75._24_4_ = uStack_3e8;
    auVar75._28_4_ = uStack_3e4;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar30,auVar75);
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar30,auVar87);
    auVar81._8_8_ = uStack_338;
    auVar81._0_8_ = local_340;
    auVar81._16_8_ = uStack_330;
    auVar81._24_8_ = uStack_328;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar30,auVar81);
    auVar79._8_8_ = uStack_358;
    auVar79._0_8_ = local_360;
    auVar79._16_8_ = uStack_350;
    auVar79._24_8_ = uStack_348;
    auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar30,auVar79);
    fVar197 = auVar271._0_4_ * fVar262;
    fVar212 = auVar271._4_4_ * fVar262;
    local_6e0._4_4_ = fVar212;
    local_6e0._0_4_ = fVar197;
    fVar213 = auVar271._8_4_ * fVar262;
    local_6e0._8_4_ = fVar213;
    fVar214 = auVar271._12_4_ * fVar262;
    local_6e0._12_4_ = fVar214;
    local_6e0._16_4_ = fVar262 * 0.0;
    local_6e0._20_4_ = fVar262 * 0.0;
    uVar102 = (undefined4)((ulong)uStack_248 >> 0x20);
    local_6e0._24_4_ = fVar262 * 0.0;
    local_6e0._28_4_ = uVar102;
    fVar279 = auVar4._0_4_ * fVar262;
    fVar282 = auVar4._4_4_ * fVar262;
    local_940._4_4_ = fVar282;
    local_940._0_4_ = fVar279;
    fVar283 = auVar4._8_4_ * fVar262;
    local_940._8_4_ = fVar283;
    fVar149 = auVar4._12_4_ * fVar262;
    local_940._12_4_ = fVar149;
    local_940._16_4_ = fVar262 * 0.0;
    local_940._20_4_ = fVar262 * 0.0;
    local_940._24_4_ = fVar262 * 0.0;
    local_940._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    local_a20._0_4_ = auVar246._0_4_ * fVar262;
    local_a20._4_4_ = auVar246._4_4_ * fVar262;
    local_a20._8_4_ = auVar246._8_4_ * fVar262;
    local_a20._12_4_ = auVar246._12_4_ * fVar262;
    local_a20._16_4_ = fVar262 * 0.0;
    local_a20._20_4_ = fVar262 * 0.0;
    local_a20._24_4_ = fVar262 * 0.0;
    local_a20._28_4_ = 0;
    auVar207._0_4_ = fVar262 * auVar5._0_4_;
    auVar207._4_4_ = fVar262 * auVar5._4_4_;
    auVar207._8_4_ = fVar262 * auVar5._8_4_;
    auVar207._12_4_ = fVar262 * auVar5._12_4_;
    auVar207._16_4_ = fVar262 * 0.0;
    auVar207._20_4_ = fVar262 * 0.0;
    auVar207._24_4_ = fVar262 * 0.0;
    auVar207._28_4_ = 0;
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar161);
    auVar160 = vpermps_avx2(_DAT_01fec480,local_820);
    local_a80 = ZEXT1632(auVar113);
    local_920 = vpermps_avx2(_DAT_01fec480,local_a80);
    auVar17 = vsubps_avx(auVar19,auVar161);
    auVar18 = vsubps_avx(local_920,ZEXT1632(auVar113));
    fVar215 = auVar18._0_4_;
    fVar216 = auVar18._4_4_;
    auVar37._4_4_ = fVar216 * fVar212;
    auVar37._0_4_ = fVar215 * fVar197;
    fVar217 = auVar18._8_4_;
    auVar37._8_4_ = fVar217 * fVar213;
    fVar218 = auVar18._12_4_;
    auVar37._12_4_ = fVar218 * fVar214;
    fVar101 = auVar18._16_4_;
    auVar37._16_4_ = fVar101 * fVar262 * 0.0;
    fVar127 = auVar18._20_4_;
    auVar37._20_4_ = fVar127 * fVar262 * 0.0;
    fVar128 = auVar18._24_4_;
    auVar37._24_4_ = fVar128 * fVar262 * 0.0;
    auVar37._28_4_ = auVar19._28_4_;
    auVar113 = vfmsub231ps_fma(auVar37,local_a20,auVar17);
    auVar120 = vsubps_avx(auVar160,local_820);
    fVar129 = auVar17._0_4_;
    fVar130 = auVar17._4_4_;
    auVar38._4_4_ = fVar130 * fVar282;
    auVar38._0_4_ = fVar129 * fVar279;
    fVar131 = auVar17._8_4_;
    auVar38._8_4_ = fVar131 * fVar283;
    fVar132 = auVar17._12_4_;
    auVar38._12_4_ = fVar132 * fVar149;
    fVar149 = auVar17._16_4_;
    auVar38._16_4_ = fVar149 * fVar262 * 0.0;
    fVar172 = auVar17._20_4_;
    auVar38._20_4_ = fVar172 * fVar262 * 0.0;
    fVar173 = auVar17._24_4_;
    auVar38._24_4_ = fVar173 * fVar262 * 0.0;
    auVar38._28_4_ = auVar160._28_4_;
    auVar271 = vfmsub231ps_fma(auVar38,local_6e0,auVar120);
    auVar113 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar271._12_4_ * auVar271._12_4_,
                                                  CONCAT48(auVar271._8_4_ * auVar271._8_4_,
                                                           CONCAT44(auVar271._4_4_ * auVar271._4_4_,
                                                                    auVar271._0_4_ * auVar271._0_4_)
                                                          ))),ZEXT1632(auVar113),ZEXT1632(auVar113))
    ;
    fVar262 = auVar120._0_4_;
    fVar174 = auVar120._4_4_;
    auVar39._4_4_ = fVar174 * local_a20._4_4_;
    auVar39._0_4_ = fVar262 * (float)local_a20._0_4_;
    fVar244 = auVar120._8_4_;
    auVar39._8_4_ = fVar244 * local_a20._8_4_;
    fVar251 = auVar120._12_4_;
    auVar39._12_4_ = fVar251 * local_a20._12_4_;
    fVar252 = auVar120._16_4_;
    auVar39._16_4_ = fVar252 * local_a20._16_4_;
    fVar253 = auVar120._20_4_;
    auVar39._20_4_ = fVar253 * local_a20._20_4_;
    fVar254 = auVar120._24_4_;
    auVar39._24_4_ = fVar254 * local_a20._24_4_;
    auVar39._28_4_ = local_920._28_4_;
    auVar4 = vfmsub231ps_fma(auVar39,local_940,auVar18);
    auVar191._0_4_ = fVar215 * fVar215;
    auVar191._4_4_ = fVar216 * fVar216;
    auVar191._8_4_ = fVar217 * fVar217;
    auVar191._12_4_ = fVar218 * fVar218;
    auVar191._16_4_ = fVar101 * fVar101;
    auVar191._20_4_ = fVar127 * fVar127;
    auVar191._24_4_ = fVar128 * fVar128;
    auVar191._28_4_ = 0;
    auVar271 = vfmadd231ps_fma(auVar191,auVar120,auVar120);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar17,auVar17);
    auVar147 = vrcpps_avx(ZEXT1632(auVar271));
    auVar4 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1632(auVar4),ZEXT1632(auVar4));
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar113 = vfnmadd213ps_fma(auVar147,ZEXT1632(auVar271),auVar119);
    auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar147,auVar147);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_6e0);
    local_8c0 = vpermps_avx2(_DAT_01fec480,local_a20);
    auVar40._4_4_ = fVar216 * local_a40._4_4_;
    auVar40._0_4_ = fVar215 * local_a40._0_4_;
    auVar40._8_4_ = fVar217 * local_a40._8_4_;
    auVar40._12_4_ = fVar218 * local_a40._12_4_;
    auVar40._16_4_ = fVar101 * local_a40._16_4_;
    auVar40._20_4_ = fVar127 * local_a40._20_4_;
    auVar40._24_4_ = fVar128 * local_a40._24_4_;
    auVar40._28_4_ = auVar147._28_4_;
    auVar246 = vfmsub231ps_fma(auVar40,local_8c0,auVar17);
    _local_840 = vpermps_avx2(_DAT_01fec480,local_940);
    auVar41._4_4_ = fVar130 * local_840._4_4_;
    auVar41._0_4_ = fVar129 * local_840._0_4_;
    auVar41._8_4_ = fVar131 * local_840._8_4_;
    auVar41._12_4_ = fVar132 * local_840._12_4_;
    auVar41._16_4_ = fVar149 * local_840._16_4_;
    auVar41._20_4_ = fVar172 * local_840._20_4_;
    auVar41._24_4_ = fVar173 * local_840._24_4_;
    auVar41._28_4_ = 0;
    auVar5 = vfmsub231ps_fma(auVar41,local_a40,auVar120);
    auVar246 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar5._12_4_ * auVar5._12_4_,
                                                  CONCAT48(auVar5._8_4_ * auVar5._8_4_,
                                                           CONCAT44(auVar5._4_4_ * auVar5._4_4_,
                                                                    auVar5._0_4_ * auVar5._0_4_)))),
                               ZEXT1632(auVar246),ZEXT1632(auVar246));
    auVar234._0_4_ = fVar262 * local_8c0._0_4_;
    auVar234._4_4_ = fVar174 * local_8c0._4_4_;
    auVar234._8_4_ = fVar244 * local_8c0._8_4_;
    auVar234._12_4_ = fVar251 * local_8c0._12_4_;
    auVar234._16_4_ = fVar252 * local_8c0._16_4_;
    auVar234._20_4_ = fVar253 * local_8c0._20_4_;
    auVar234._24_4_ = fVar254 * local_8c0._24_4_;
    auVar234._28_4_ = 0;
    auVar5 = vfmsub231ps_fma(auVar234,_local_840,auVar18);
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),ZEXT1632(auVar5),ZEXT1632(auVar5));
    auVar147 = vmaxps_avx(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar113._12_4_,
                                             CONCAT48(auVar4._8_4_ * auVar113._8_4_,
                                                      CONCAT44(auVar4._4_4_ * auVar113._4_4_,
                                                               auVar4._0_4_ * auVar113._0_4_)))),
                          ZEXT1632(CONCAT412(auVar246._12_4_ * auVar113._12_4_,
                                             CONCAT48(auVar246._8_4_ * auVar113._8_4_,
                                                      CONCAT44(auVar246._4_4_ * auVar113._4_4_,
                                                               auVar246._0_4_ * auVar113._0_4_)))));
    local_700._0_4_ = auVar108._0_4_ + auVar207._0_4_;
    local_700._4_4_ = auVar108._4_4_ + auVar207._4_4_;
    local_700._8_4_ = auVar108._8_4_ + auVar207._8_4_;
    local_700._12_4_ = auVar108._12_4_ + auVar207._12_4_;
    local_700._16_4_ = auVar207._16_4_ + 0.0;
    local_700._20_4_ = auVar207._20_4_ + 0.0;
    local_700._24_4_ = auVar207._24_4_ + 0.0;
    local_700._28_4_ = 0;
    auVar232 = ZEXT1632(auVar108);
    auVar117 = vsubps_avx(auVar232,auVar207);
    local_720 = vpermps_avx2(_DAT_01fec480,auVar117);
    local_740 = vpermps_avx2(_DAT_01fec480,auVar232);
    auVar117 = vmaxps_avx(auVar232,local_700);
    auVar278 = vmaxps_avx(local_720,local_740);
    auVar266 = vrsqrtps_avx(ZEXT1632(auVar271));
    auVar117 = vmaxps_avx(auVar117,auVar278);
    fVar197 = auVar266._0_4_;
    fVar212 = auVar266._4_4_;
    fVar213 = auVar266._8_4_;
    fVar214 = auVar266._12_4_;
    fVar279 = auVar266._16_4_;
    fVar282 = auVar266._20_4_;
    fVar283 = auVar266._24_4_;
    auVar248._0_4_ = fVar197 * fVar197 * fVar197 * auVar271._0_4_ * -0.5;
    auVar248._4_4_ = fVar212 * fVar212 * fVar212 * auVar271._4_4_ * -0.5;
    auVar248._8_4_ = fVar213 * fVar213 * fVar213 * auVar271._8_4_ * -0.5;
    auVar248._12_4_ = fVar214 * fVar214 * fVar214 * auVar271._12_4_ * -0.5;
    auVar248._16_4_ = fVar279 * fVar279 * fVar279 * -0.0;
    auVar248._20_4_ = fVar282 * fVar282 * fVar282 * -0.0;
    auVar248._24_4_ = fVar283 * fVar283 * fVar283 * -0.0;
    auVar248._28_4_ = 0;
    auVar139._8_4_ = 0x3fc00000;
    auVar139._0_8_ = 0x3fc000003fc00000;
    auVar139._12_4_ = 0x3fc00000;
    auVar139._16_4_ = 0x3fc00000;
    auVar139._20_4_ = 0x3fc00000;
    auVar139._24_4_ = 0x3fc00000;
    auVar139._28_4_ = 0x3fc00000;
    auVar113 = vfmadd231ps_fma(auVar248,auVar139,auVar266);
    auVar250 = ZEXT1664(auVar113);
    fVar212 = auVar113._0_4_;
    fVar213 = auVar113._4_4_;
    auVar42._4_4_ = fVar174 * fVar213;
    auVar42._0_4_ = fVar262 * fVar212;
    fVar279 = auVar113._8_4_;
    auVar42._8_4_ = fVar244 * fVar279;
    fVar283 = auVar113._12_4_;
    auVar42._12_4_ = fVar251 * fVar283;
    auVar42._16_4_ = fVar252 * 0.0;
    auVar42._20_4_ = fVar253 * 0.0;
    auVar42._24_4_ = fVar254 * 0.0;
    auVar42._28_4_ = 0;
    auVar15._4_4_ = fStack_5fc;
    auVar15._0_4_ = local_600;
    auVar15._8_4_ = fStack_5f8;
    auVar15._12_4_ = fStack_5f4;
    auVar15._16_4_ = fStack_5f0;
    auVar15._20_4_ = fStack_5ec;
    auVar15._24_4_ = fStack_5e8;
    auVar15._28_4_ = fStack_5e4;
    auVar43._4_4_ = fStack_5fc * fVar216 * fVar213;
    auVar43._0_4_ = local_600 * fVar215 * fVar212;
    auVar43._8_4_ = fStack_5f8 * fVar217 * fVar279;
    auVar43._12_4_ = fStack_5f4 * fVar218 * fVar283;
    auVar43._16_4_ = fStack_5f0 * fVar101 * 0.0;
    auVar43._20_4_ = fStack_5ec * fVar127 * 0.0;
    auVar43._24_4_ = fStack_5e8 * fVar128 * 0.0;
    auVar43._28_4_ = auVar18._28_4_;
    auVar113 = vfmadd231ps_fma(auVar43,auVar42,_local_7a0);
    auVar278 = vsubps_avx(ZEXT832(0) << 0x20,local_a80);
    fVar174 = auVar278._0_4_;
    auVar277._0_4_ = fVar174 * fVar215 * fVar212;
    fVar244 = auVar278._4_4_;
    auVar277._4_4_ = fVar244 * fVar216 * fVar213;
    fVar251 = auVar278._8_4_;
    auVar277._8_4_ = fVar251 * fVar217 * fVar279;
    fVar252 = auVar278._12_4_;
    auVar277._12_4_ = fVar252 * fVar218 * fVar283;
    fVar253 = auVar278._16_4_;
    auVar277._16_4_ = fVar253 * fVar101 * 0.0;
    fVar254 = auVar278._20_4_;
    auVar277._20_4_ = fVar254 * fVar127 * 0.0;
    fVar255 = auVar278._24_4_;
    auVar277._24_4_ = fVar255 * fVar128 * 0.0;
    auVar277._28_4_ = 0;
    auVar266 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
    auVar108 = vfmadd231ps_fma(auVar277,auVar266,auVar42);
    auVar44._4_4_ = fVar130 * fVar213;
    auVar44._0_4_ = fVar129 * fVar212;
    auVar44._8_4_ = fVar131 * fVar279;
    auVar44._12_4_ = fVar132 * fVar283;
    auVar44._16_4_ = fVar149 * 0.0;
    auVar44._20_4_ = fVar172 * 0.0;
    auVar44._24_4_ = fVar173 * 0.0;
    auVar44._28_4_ = 0;
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar44,_local_560);
    auVar259 = ZEXT1664(auVar113);
    auVar240 = vsubps_avx(ZEXT832(0) << 0x20,auVar161);
    auVar261 = ZEXT3264(auVar240);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar240,auVar44);
    auVar45._4_4_ = fStack_5fc * fVar244;
    auVar45._0_4_ = local_600 * fVar174;
    auVar45._8_4_ = fStack_5f8 * fVar251;
    auVar45._12_4_ = fStack_5f4 * fVar252;
    auVar45._16_4_ = fStack_5f0 * fVar253;
    auVar45._20_4_ = fStack_5ec * fVar254;
    auVar45._24_4_ = fStack_5e8 * fVar255;
    auVar45._28_4_ = 0;
    auVar271 = vfmadd231ps_fma(auVar45,_local_7a0,auVar266);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),_local_560,auVar240);
    fVar197 = auVar108._0_4_;
    fVar262 = auVar113._0_4_;
    fVar214 = auVar108._4_4_;
    fVar101 = auVar113._4_4_;
    fVar282 = auVar108._8_4_;
    fVar127 = auVar113._8_4_;
    fVar215 = auVar108._12_4_;
    fVar128 = auVar113._12_4_;
    auVar229 = vsubps_avx(ZEXT1632(auVar271),
                          ZEXT1632(CONCAT412(fVar128 * fVar215,
                                             CONCAT48(fVar127 * fVar282,
                                                      CONCAT44(fVar101 * fVar214,fVar262 * fVar197))
                                            )));
    auVar46._4_4_ = fVar244 * fVar244;
    auVar46._0_4_ = fVar174 * fVar174;
    auVar46._8_4_ = fVar251 * fVar251;
    auVar46._12_4_ = fVar252 * fVar252;
    auVar46._16_4_ = fVar253 * fVar253;
    auVar46._20_4_ = fVar254 * fVar254;
    auVar46._24_4_ = fVar255 * fVar255;
    auVar46._28_4_ = 0;
    auVar271 = vfmadd231ps_fma(auVar46,auVar266,auVar266);
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar240,auVar240);
    auVar47._28_4_ = uVar102;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * fVar215,
                            CONCAT48(fVar282 * fVar282,CONCAT44(fVar214 * fVar214,fVar197 * fVar197)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar271),auVar47);
    auVar278 = vsqrtps_avx(auVar147);
    fVar197 = (auVar278._0_4_ + auVar117._0_4_) * 1.0000002;
    fVar214 = (auVar278._4_4_ + auVar117._4_4_) * 1.0000002;
    fVar282 = (auVar278._8_4_ + auVar117._8_4_) * 1.0000002;
    fVar215 = (auVar278._12_4_ + auVar117._12_4_) * 1.0000002;
    fVar216 = (auVar278._16_4_ + auVar117._16_4_) * 1.0000002;
    fVar217 = (auVar278._20_4_ + auVar117._20_4_) * 1.0000002;
    fVar218 = (auVar278._24_4_ + auVar117._24_4_) * 1.0000002;
    auVar48._4_4_ = fVar214 * fVar214;
    auVar48._0_4_ = fVar197 * fVar197;
    auVar48._8_4_ = fVar282 * fVar282;
    auVar48._12_4_ = fVar215 * fVar215;
    auVar48._16_4_ = fVar216 * fVar216;
    auVar48._20_4_ = fVar217 * fVar217;
    auVar48._24_4_ = fVar218 * fVar218;
    auVar48._28_4_ = auVar278._28_4_ + auVar117._28_4_;
    auVar162._0_4_ = auVar229._0_4_ + auVar229._0_4_;
    auVar162._4_4_ = auVar229._4_4_ + auVar229._4_4_;
    auVar162._8_4_ = auVar229._8_4_ + auVar229._8_4_;
    auVar162._12_4_ = auVar229._12_4_ + auVar229._12_4_;
    auVar162._16_4_ = auVar229._16_4_ + auVar229._16_4_;
    auVar162._20_4_ = auVar229._20_4_ + auVar229._20_4_;
    auVar162._24_4_ = auVar229._24_4_ + auVar229._24_4_;
    auVar162._28_4_ = auVar229._28_4_ + auVar229._28_4_;
    auVar117 = vsubps_avx(auVar16,auVar48);
    auVar228 = ZEXT1632(auVar113);
    auVar49._28_4_ = 0x3f800002;
    auVar49._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * fVar128,
                            CONCAT48(fVar127 * fVar127,CONCAT44(fVar101 * fVar101,fVar262 * fVar262)
                                    )));
    local_960 = vsubps_avx(local_280,auVar49);
    auVar50._4_4_ = auVar162._4_4_ * auVar162._4_4_;
    auVar50._0_4_ = auVar162._0_4_ * auVar162._0_4_;
    auVar50._8_4_ = auVar162._8_4_ * auVar162._8_4_;
    auVar50._12_4_ = auVar162._12_4_ * auVar162._12_4_;
    auVar50._16_4_ = auVar162._16_4_ * auVar162._16_4_;
    auVar50._20_4_ = auVar162._20_4_ * auVar162._20_4_;
    auVar50._24_4_ = auVar162._24_4_ * auVar162._24_4_;
    auVar50._28_4_ = auVar147._28_4_;
    fVar214 = local_960._0_4_;
    fVar282 = local_960._4_4_;
    fVar215 = local_960._8_4_;
    fVar216 = local_960._12_4_;
    fVar217 = local_960._16_4_;
    fVar218 = local_960._20_4_;
    fVar262 = local_960._24_4_;
    auVar51._4_4_ = auVar117._4_4_ * fVar282 * 4.0;
    auVar51._0_4_ = auVar117._0_4_ * fVar214 * 4.0;
    auVar51._8_4_ = auVar117._8_4_ * fVar215 * 4.0;
    auVar51._12_4_ = auVar117._12_4_ * fVar216 * 4.0;
    auVar51._16_4_ = auVar117._16_4_ * fVar217 * 4.0;
    auVar51._20_4_ = auVar117._20_4_ * fVar218 * 4.0;
    auVar51._24_4_ = auVar117._24_4_ * fVar262 * 4.0;
    auVar51._28_4_ = 0x40800000;
    auVar229 = vsubps_avx(auVar50,auVar51);
    auVar147 = vcmpps_avx(auVar229,ZEXT432(0) << 0x20,5);
    auVar233 = ZEXT1632(auVar108);
    fVar197 = local_960._28_4_;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      auVar192._8_4_ = 0x7f800000;
      auVar192._0_8_ = 0x7f8000007f800000;
      auVar192._12_4_ = 0x7f800000;
      auVar192._16_4_ = 0x7f800000;
      auVar192._20_4_ = 0x7f800000;
      auVar192._24_4_ = 0x7f800000;
      auVar192._28_4_ = 0x7f800000;
      auVar163._8_4_ = 0xff800000;
      auVar163._0_8_ = 0xff800000ff800000;
      auVar163._12_4_ = 0xff800000;
      auVar163._16_4_ = 0xff800000;
      auVar163._20_4_ = 0xff800000;
      auVar163._24_4_ = 0xff800000;
      auVar163._28_4_ = 0xff800000;
      auVar229 = auVar50;
LAB_018975e6:
      auVar270 = ZEXT3264(auVar15);
    }
    else {
      auVar263 = vsqrtps_avx(auVar229);
      auVar264._0_4_ = fVar214 + fVar214;
      auVar264._4_4_ = fVar282 + fVar282;
      auVar264._8_4_ = fVar215 + fVar215;
      auVar264._12_4_ = fVar216 + fVar216;
      auVar264._16_4_ = fVar217 + fVar217;
      auVar264._20_4_ = fVar218 + fVar218;
      auVar264._24_4_ = fVar262 + fVar262;
      auVar264._28_4_ = fVar197 + fVar197;
      auVar247 = vrcpps_avx(auVar264);
      auVar210 = vcmpps_avx(auVar229,ZEXT832(0) << 0x20,5);
      auVar193._8_4_ = 0x3f800000;
      auVar193._0_8_ = 0x3f8000003f800000;
      auVar193._12_4_ = 0x3f800000;
      auVar193._16_4_ = 0x3f800000;
      auVar193._20_4_ = 0x3f800000;
      auVar193._24_4_ = 0x3f800000;
      auVar193._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_fma(auVar264,auVar247,auVar193);
      auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar247,auVar247);
      auVar194._0_4_ = (uint)auVar162._0_4_ ^ local_620;
      auVar194._4_4_ = (uint)auVar162._4_4_ ^ uStack_61c;
      auVar194._8_4_ = (uint)auVar162._8_4_ ^ uStack_618;
      auVar194._12_4_ = (uint)auVar162._12_4_ ^ uStack_614;
      auVar194._16_4_ = (uint)auVar162._16_4_ ^ (uint)fStack_610;
      auVar194._20_4_ = (uint)auVar162._20_4_ ^ (uint)fStack_60c;
      auVar194._24_4_ = (uint)auVar162._24_4_ ^ (uint)fStack_608;
      auVar194._28_4_ = (uint)auVar162._28_4_ ^ uStack_604;
      auVar229 = vsubps_avx(auVar194,auVar263);
      auVar52._4_4_ = auVar113._4_4_ * auVar229._4_4_;
      auVar52._0_4_ = auVar113._0_4_ * auVar229._0_4_;
      auVar52._8_4_ = auVar113._8_4_ * auVar229._8_4_;
      auVar52._12_4_ = auVar113._12_4_ * auVar229._12_4_;
      auVar52._16_4_ = auVar229._16_4_ * 0.0;
      auVar52._20_4_ = auVar229._20_4_ * 0.0;
      auVar52._24_4_ = auVar229._24_4_ * 0.0;
      auVar52._28_4_ = auVar229._28_4_;
      auVar229 = vsubps_avx(auVar263,auVar162);
      auVar53._4_4_ = auVar113._4_4_ * auVar229._4_4_;
      auVar53._0_4_ = auVar113._0_4_ * auVar229._0_4_;
      auVar53._8_4_ = auVar113._8_4_ * auVar229._8_4_;
      auVar53._12_4_ = auVar113._12_4_ * auVar229._12_4_;
      auVar53._16_4_ = auVar229._16_4_ * 0.0;
      auVar53._20_4_ = auVar229._20_4_ * 0.0;
      auVar53._24_4_ = auVar229._24_4_ * 0.0;
      auVar53._28_4_ = auVar229._28_4_;
      auVar113 = vfmadd213ps_fma(auVar228,auVar52,auVar233);
      _local_5c0 = ZEXT1628(CONCAT412(fVar283 * auVar113._12_4_,
                                      CONCAT48(fVar279 * auVar113._8_4_,
                                               CONCAT44(fVar213 * auVar113._4_4_,
                                                        fVar212 * auVar113._0_4_))));
      fStack_5a4 = auVar162._28_4_;
      auVar229 = vandps_avx(local_7c0,auVar49);
      auVar229 = vmaxps_avx(local_480,auVar229);
      auVar54._4_4_ = auVar229._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar229._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar229._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar229._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar229._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar229._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar229._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar229._28_4_;
      auVar229 = vandps_avx(local_7c0,local_960);
      auVar229 = vcmpps_avx(auVar229,auVar54,1);
      auVar113 = vfmadd213ps_fma(auVar228,auVar53,auVar233);
      auVar270 = ZEXT1664(auVar113);
      auVar140._8_4_ = 0x7f800000;
      auVar140._0_8_ = 0x7f8000007f800000;
      auVar140._12_4_ = 0x7f800000;
      auVar140._16_4_ = 0x7f800000;
      auVar140._20_4_ = 0x7f800000;
      auVar140._24_4_ = 0x7f800000;
      auVar140._28_4_ = 0x7f800000;
      auVar192 = vblendvps_avx(auVar140,auVar52,auVar210);
      local_5e0 = (undefined1  [8])CONCAT44(fVar213 * auVar113._4_4_,fVar212 * auVar113._0_4_);
      _local_5e0 = CONCAT48(fVar279 * auVar113._8_4_,local_5e0);
      _local_5e0 = CONCAT412(fVar283 * auVar113._12_4_,_local_5e0);
      _local_5e0 = ZEXT1628(_local_5e0);
      uStack_5c4 = 0x7f800000;
      auVar141._8_4_ = 0xff800000;
      auVar141._0_8_ = 0xff800000ff800000;
      auVar141._12_4_ = 0xff800000;
      auVar141._16_4_ = 0xff800000;
      auVar141._20_4_ = 0xff800000;
      auVar141._24_4_ = 0xff800000;
      auVar141._28_4_ = 0xff800000;
      auVar163 = vblendvps_avx(auVar141,auVar53,auVar210);
      auVar247 = auVar210 & auVar229;
      if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar247 >> 0x7f,0) != '\0') ||
            (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar247 >> 0xbf,0) != '\0') ||
          (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar247[0x1f] < '\0') {
        auVar147 = vandps_avx(auVar210,auVar229);
        auVar15 = vcmpps_avx(auVar117,ZEXT832(0) << 0x20,2);
        auVar148._8_4_ = 0xff800000;
        auVar148._0_8_ = 0xff800000ff800000;
        auVar148._12_4_ = 0xff800000;
        auVar148._16_4_ = 0xff800000;
        auVar148._20_4_ = 0xff800000;
        auVar148._24_4_ = 0xff800000;
        auVar148._28_4_ = 0xff800000;
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar117 = vblendvps_avx(auVar225,auVar148,auVar15);
        auVar113 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
        auVar229 = vpmovsxwd_avx2(auVar113);
        auVar192 = vblendvps_avx(auVar192,auVar117,auVar229);
        auVar117 = vblendvps_avx(auVar148,auVar225,auVar15);
        auVar163 = vblendvps_avx(auVar163,auVar117,auVar229);
        auVar211._0_8_ = auVar147._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar147._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar147._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar147._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar147._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar147._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar147._28_4_ ^ 0xffffffff;
        auVar147 = vorps_avx(auVar15,auVar211);
        auVar147 = vandps_avx(auVar210,auVar147);
        goto LAB_018975e6;
      }
    }
    auVar231 = ZEXT3264(auVar229);
    auVar117 = local_2c0 & auVar147;
    fVar101 = (float)local_aa0._0_4_;
    fVar127 = (float)local_aa0._4_4_;
    fVar128 = fStack_a98;
    fVar129 = fStack_a94;
    fVar130 = fStack_a90;
    fVar131 = fStack_a8c;
    fVar132 = fStack_a88;
    fVar149 = fStack_a84;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar117 >> 0x7f,0) != '\0') ||
          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar117 >> 0xbf,0) != '\0') ||
        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar117[0x1f] < '\0') {
      fVar172 = (ray->org).field_0.m128[3] - (float)local_7e0._0_4_;
      auVar208._4_4_ = fVar172;
      auVar208._0_4_ = fVar172;
      auVar208._8_4_ = fVar172;
      auVar208._12_4_ = fVar172;
      auVar208._16_4_ = fVar172;
      auVar208._20_4_ = fVar172;
      auVar208._24_4_ = fVar172;
      auVar208._28_4_ = fVar172;
      auVar210 = vmaxps_avx(auVar208,auVar192);
      fVar172 = ray->tfar - (float)local_7e0._0_4_;
      auVar209._4_4_ = fVar172;
      auVar209._0_4_ = fVar172;
      auVar209._8_4_ = fVar172;
      auVar209._12_4_ = fVar172;
      auVar209._16_4_ = fVar172;
      auVar209._20_4_ = fVar172;
      auVar209._24_4_ = fVar172;
      auVar209._28_4_ = fVar172;
      auVar247 = vminps_avx(auVar209,auVar163);
      auVar71._4_4_ = local_a20._4_4_ * fVar244;
      auVar71._0_4_ = (float)local_a20._0_4_ * fVar174;
      auVar71._8_4_ = local_a20._8_4_ * fVar251;
      auVar71._12_4_ = local_a20._12_4_ * fVar252;
      auVar71._16_4_ = local_a20._16_4_ * fVar253;
      auVar71._20_4_ = local_a20._20_4_ * fVar254;
      auVar71._24_4_ = local_a20._24_4_ * fVar255;
      auVar71._28_4_ = auVar229._28_4_;
      auVar113 = vfmadd213ps_fma(auVar266,local_940,auVar71);
      auVar108 = vfmadd213ps_fma(auVar240,local_6e0,ZEXT1632(auVar113));
      auVar55._4_4_ = local_a20._4_4_ * fStack_5fc;
      auVar55._0_4_ = (float)local_a20._0_4_ * local_600;
      auVar55._8_4_ = local_a20._8_4_ * fStack_5f8;
      auVar55._12_4_ = local_a20._12_4_ * fStack_5f4;
      auVar55._16_4_ = local_a20._16_4_ * fStack_5f0;
      auVar55._20_4_ = local_a20._20_4_ * fStack_5ec;
      auVar55._24_4_ = local_a20._24_4_ * fStack_5e8;
      auVar55._28_4_ = auVar229._28_4_;
      auVar113 = vfmadd231ps_fma(auVar55,_local_7a0,local_940);
      auVar271 = vfmadd231ps_fma(ZEXT1632(auVar113),_local_560,local_6e0);
      auVar117 = vandps_avx(local_7c0,ZEXT1632(auVar271));
      auVar235._8_4_ = 0x219392ef;
      auVar235._0_8_ = 0x219392ef219392ef;
      auVar235._12_4_ = 0x219392ef;
      auVar235._16_4_ = 0x219392ef;
      auVar235._20_4_ = 0x219392ef;
      auVar235._24_4_ = 0x219392ef;
      auVar235._28_4_ = 0x219392ef;
      auVar266 = vcmpps_avx(auVar117,auVar235,1);
      auVar117 = vrcpps_avx(ZEXT1632(auVar271));
      auVar273._8_4_ = 0x3f800000;
      auVar273._0_8_ = 0x3f8000003f800000;
      auVar273._12_4_ = 0x3f800000;
      auVar273._16_4_ = 0x3f800000;
      auVar273._20_4_ = 0x3f800000;
      auVar273._24_4_ = 0x3f800000;
      auVar273._28_4_ = 0x3f800000;
      auVar229 = ZEXT1632(auVar271);
      auVar113 = vfnmadd213ps_fma(auVar117,auVar229,auVar273);
      auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar117,auVar117);
      auVar274._0_4_ = auVar271._0_4_ ^ local_620;
      auVar274._4_4_ = auVar271._4_4_ ^ uStack_61c;
      auVar274._8_4_ = auVar271._8_4_ ^ uStack_618;
      auVar274._12_4_ = auVar271._12_4_ ^ uStack_614;
      auVar274._16_4_ = fStack_610;
      auVar274._20_4_ = fStack_60c;
      auVar274._24_4_ = fStack_608;
      auVar274._28_4_ = uStack_604;
      auVar56._4_4_ = auVar113._4_4_ * (float)(auVar108._4_4_ ^ uStack_61c);
      auVar56._0_4_ = auVar113._0_4_ * (float)(auVar108._0_4_ ^ local_620);
      auVar56._8_4_ = auVar113._8_4_ * (float)(auVar108._8_4_ ^ uStack_618);
      auVar56._12_4_ = auVar113._12_4_ * (float)(auVar108._12_4_ ^ uStack_614);
      auVar56._16_4_ = fStack_610 * 0.0;
      auVar56._20_4_ = fStack_60c * 0.0;
      auVar56._24_4_ = fStack_608 * 0.0;
      auVar56._28_4_ = uStack_604;
      auVar117 = vcmpps_avx(auVar229,auVar274,1);
      auVar117 = vorps_avx(auVar266,auVar117);
      auVar265._8_4_ = 0xff800000;
      auVar265._0_8_ = 0xff800000ff800000;
      auVar265._12_4_ = 0xff800000;
      auVar265._16_4_ = 0xff800000;
      auVar265._20_4_ = 0xff800000;
      auVar265._24_4_ = 0xff800000;
      auVar265._28_4_ = 0xff800000;
      auVar117 = vblendvps_avx(auVar56,auVar265,auVar117);
      auVar240 = vmaxps_avx(auVar210,auVar117);
      auVar117 = vcmpps_avx(auVar229,auVar274,6);
      auVar117 = vorps_avx(auVar266,auVar117);
      auVar275._8_4_ = 0x7f800000;
      auVar275._0_8_ = 0x7f8000007f800000;
      auVar275._12_4_ = 0x7f800000;
      auVar275._16_4_ = 0x7f800000;
      auVar275._20_4_ = 0x7f800000;
      auVar275._24_4_ = 0x7f800000;
      auVar275._28_4_ = 0x7f800000;
      auVar117 = vblendvps_avx(auVar56,auVar275,auVar117);
      auVar229 = vminps_avx(auVar247,auVar117);
      fVar172 = (float)(local_620 ^ (uint)local_8c0._0_4_);
      fVar173 = (float)(uStack_61c ^ (uint)local_8c0._4_4_);
      fVar174 = (float)(uStack_618 ^ (uint)local_8c0._8_4_);
      fVar244 = (float)(uStack_614 ^ (uint)local_8c0._12_4_);
      fVar251 = (float)((uint)fStack_610 ^ (uint)local_8c0._16_4_);
      fVar252 = (float)((uint)fStack_60c ^ (uint)local_8c0._20_4_);
      fVar253 = (float)((uint)fStack_608 ^ (uint)local_8c0._24_4_);
      auVar230._0_4_ = local_620 ^ (uint)local_840._0_4_;
      auVar230._4_4_ = uStack_61c ^ (uint)local_840._4_4_;
      auVar230._8_4_ = uStack_618 ^ (uint)local_840._8_4_;
      auVar230._12_4_ = uStack_614 ^ (uint)local_840._12_4_;
      auVar230._16_4_ = (uint)fStack_610 ^ (uint)local_840._16_4_;
      auVar230._20_4_ = (uint)fStack_60c ^ (uint)local_840._20_4_;
      auVar230._24_4_ = (uint)fStack_608 ^ (uint)local_840._24_4_;
      auVar230._28_4_ = uStack_604 ^ uStack_824;
      auVar266 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar117 = vsubps_avx(auVar266,auVar160);
      auVar266 = vsubps_avx(auVar266,local_920);
      auVar57._4_4_ = auVar266._4_4_ * fVar173;
      auVar57._0_4_ = auVar266._0_4_ * fVar172;
      auVar57._8_4_ = auVar266._8_4_ * fVar174;
      auVar57._12_4_ = auVar266._12_4_ * fVar244;
      auVar57._16_4_ = auVar266._16_4_ * fVar251;
      auVar57._20_4_ = auVar266._20_4_ * fVar252;
      auVar57._24_4_ = auVar266._24_4_ * fVar253;
      auVar57._28_4_ = auVar266._28_4_;
      auVar113 = vfmadd231ps_fma(auVar57,auVar230,auVar117);
      auVar236._0_4_ = local_620 ^ (uint)local_a40._0_4_;
      auVar236._4_4_ = uStack_61c ^ (uint)local_a40._4_4_;
      auVar236._8_4_ = uStack_618 ^ (uint)local_a40._8_4_;
      auVar236._12_4_ = uStack_614 ^ (uint)local_a40._12_4_;
      auVar236._16_4_ = (uint)fStack_610 ^ (uint)local_a40._16_4_;
      auVar236._20_4_ = (uint)fStack_60c ^ (uint)local_a40._20_4_;
      auVar236._24_4_ = (uint)fStack_608 ^ (uint)local_a40._24_4_;
      auVar236._28_4_ = uStack_604 ^ local_a40._28_4_;
      auVar117 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar19);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar236,auVar117);
      auVar58._4_4_ = fVar173 * fStack_5fc;
      auVar58._0_4_ = fVar172 * local_600;
      auVar58._8_4_ = fVar174 * fStack_5f8;
      auVar58._12_4_ = fVar244 * fStack_5f4;
      auVar58._16_4_ = fVar251 * fStack_5f0;
      auVar58._20_4_ = fVar252 * fStack_5ec;
      auVar58._24_4_ = fVar253 * fStack_5e8;
      auVar58._28_4_ = uStack_604 ^ local_8c0._28_4_;
      auVar113 = vfmadd231ps_fma(auVar58,auVar230,_local_7a0);
      auVar271 = vfmadd231ps_fma(ZEXT1632(auVar113),_local_560,auVar236);
      auVar117 = vandps_avx(local_7c0,ZEXT1632(auVar271));
      auVar19 = vrcpps_avx(ZEXT1632(auVar271));
      auVar267._8_4_ = 0x219392ef;
      auVar267._0_8_ = 0x219392ef219392ef;
      auVar267._12_4_ = 0x219392ef;
      auVar267._16_4_ = 0x219392ef;
      auVar267._20_4_ = 0x219392ef;
      auVar267._24_4_ = 0x219392ef;
      auVar267._28_4_ = 0x219392ef;
      auVar266 = vcmpps_avx(auVar117,auVar267,1);
      auVar231 = ZEXT3264(auVar266);
      auVar164._8_4_ = 0x3f800000;
      auVar164._0_8_ = 0x3f8000003f800000;
      auVar164._12_4_ = 0x3f800000;
      auVar164._16_4_ = 0x3f800000;
      auVar164._20_4_ = 0x3f800000;
      auVar164._24_4_ = 0x3f800000;
      auVar164._28_4_ = 0x3f800000;
      auVar210 = ZEXT1632(auVar271);
      auVar113 = vfnmadd213ps_fma(auVar19,auVar210,auVar164);
      auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar19,auVar19);
      auVar237._0_4_ = auVar271._0_4_ ^ local_620;
      auVar237._4_4_ = auVar271._4_4_ ^ uStack_61c;
      auVar237._8_4_ = auVar271._8_4_ ^ uStack_618;
      auVar237._12_4_ = auVar271._12_4_ ^ uStack_614;
      auVar237._16_4_ = fStack_610;
      auVar237._20_4_ = fStack_60c;
      auVar237._24_4_ = fStack_608;
      auVar237._28_4_ = uStack_604;
      auVar59._4_4_ = auVar113._4_4_ * (float)(auVar108._4_4_ ^ uStack_61c);
      auVar59._0_4_ = auVar113._0_4_ * (float)(auVar108._0_4_ ^ local_620);
      auVar59._8_4_ = auVar113._8_4_ * (float)(auVar108._8_4_ ^ uStack_618);
      auVar59._12_4_ = auVar113._12_4_ * (float)(auVar108._12_4_ ^ uStack_614);
      auVar59._16_4_ = fStack_610 * 0.0;
      auVar59._20_4_ = fStack_60c * 0.0;
      auVar59._24_4_ = fStack_608 * 0.0;
      auVar59._28_4_ = uStack_604;
      auVar261 = ZEXT3264(auVar59);
      auVar117 = vcmpps_avx(auVar210,auVar237,1);
      auVar117 = vorps_avx(auVar117,auVar266);
      auVar142._8_4_ = 0xff800000;
      auVar142._0_8_ = 0xff800000ff800000;
      auVar142._12_4_ = 0xff800000;
      auVar142._16_4_ = 0xff800000;
      auVar142._20_4_ = 0xff800000;
      auVar142._24_4_ = 0xff800000;
      auVar142._28_4_ = 0xff800000;
      auVar117 = vblendvps_avx(auVar59,auVar142,auVar117);
      _local_880 = vmaxps_avx(auVar240,auVar117);
      auVar270 = ZEXT3264(_local_880);
      auVar117 = vcmpps_avx(auVar210,auVar237,6);
      auVar117 = vorps_avx(auVar266,auVar117);
      auVar117 = vblendvps_avx(auVar59,auVar275,auVar117);
      auVar147 = vandps_avx(local_2c0,auVar147);
      local_4e0 = vminps_avx(auVar229,auVar117);
      auVar117 = vcmpps_avx(_local_880,local_4e0,2);
      auVar266 = auVar147 & auVar117;
      if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar266 >> 0x7f,0) != '\0') ||
            (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar266 >> 0xbf,0) != '\0') ||
          (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar266[0x1f] < '\0') {
        auVar266 = vminps_avx(_local_5c0,auVar164);
        auVar229 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar266 = vmaxps_avx(auVar266,auVar229);
        auVar240 = vminps_avx(_local_5e0,auVar164);
        auVar240 = vmaxps_avx(auVar240,auVar229);
        fVar172 = DAT_01faff40._28_4_;
        auVar60._4_4_ = (auVar266._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar60._0_4_ = (auVar266._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar60._8_4_ = (auVar266._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar60._12_4_ = (auVar266._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar60._16_4_ = (auVar266._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar60._20_4_ = (auVar266._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar60._24_4_ = (auVar266._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar60._28_4_ = auVar266._28_4_ + fVar172;
        auVar113 = vfmadd213ps_fma(auVar60,local_800,local_780);
        auVar61._4_4_ = (auVar240._4_4_ + DAT_01faff40._4_4_) * 0.125;
        auVar61._0_4_ = (auVar240._0_4_ + (float)DAT_01faff40) * 0.125;
        auVar61._8_4_ = (auVar240._8_4_ + DAT_01faff40._8_4_) * 0.125;
        auVar61._12_4_ = (auVar240._12_4_ + DAT_01faff40._12_4_) * 0.125;
        auVar61._16_4_ = (auVar240._16_4_ + DAT_01faff40._16_4_) * 0.125;
        auVar61._20_4_ = (auVar240._20_4_ + DAT_01faff40._20_4_) * 0.125;
        auVar61._24_4_ = (auVar240._24_4_ + DAT_01faff40._24_4_) * 0.125;
        auVar61._28_4_ = auVar240._28_4_ + fVar172;
        auVar108 = vfmadd213ps_fma(auVar61,local_800,local_780);
        auVar266 = vminps_avx(auVar232,local_700);
        auVar240 = vminps_avx(local_720,local_740);
        auVar266 = vminps_avx(auVar266,auVar240);
        auVar278 = vsubps_avx(auVar266,auVar278);
        auVar147 = vandps_avx(auVar117,auVar147);
        local_1a0 = ZEXT1632(auVar113);
        local_1c0 = ZEXT1632(auVar108);
        auVar62._4_4_ = auVar278._4_4_ * 0.99999976;
        auVar62._0_4_ = auVar278._0_4_ * 0.99999976;
        auVar62._8_4_ = auVar278._8_4_ * 0.99999976;
        auVar62._12_4_ = auVar278._12_4_ * 0.99999976;
        auVar62._16_4_ = auVar278._16_4_ * 0.99999976;
        auVar62._20_4_ = auVar278._20_4_ * 0.99999976;
        auVar62._24_4_ = auVar278._24_4_ * 0.99999976;
        auVar62._28_4_ = auVar278._28_4_;
        auVar117 = vmaxps_avx(ZEXT832(0) << 0x20,auVar62);
        auVar63._4_4_ = auVar117._4_4_ * auVar117._4_4_;
        auVar63._0_4_ = auVar117._0_4_ * auVar117._0_4_;
        auVar63._8_4_ = auVar117._8_4_ * auVar117._8_4_;
        auVar63._12_4_ = auVar117._12_4_ * auVar117._12_4_;
        auVar63._16_4_ = auVar117._16_4_ * auVar117._16_4_;
        auVar63._20_4_ = auVar117._20_4_ * auVar117._20_4_;
        auVar63._24_4_ = auVar117._24_4_ * auVar117._24_4_;
        auVar63._28_4_ = auVar117._28_4_;
        auVar278 = vsubps_avx(auVar16,auVar63);
        auVar64._4_4_ = auVar278._4_4_ * fVar282 * 4.0;
        auVar64._0_4_ = auVar278._0_4_ * fVar214 * 4.0;
        auVar64._8_4_ = auVar278._8_4_ * fVar215 * 4.0;
        auVar64._12_4_ = auVar278._12_4_ * fVar216 * 4.0;
        auVar64._16_4_ = auVar278._16_4_ * fVar217 * 4.0;
        auVar64._20_4_ = auVar278._20_4_ * fVar218 * 4.0;
        auVar64._24_4_ = auVar278._24_4_ * fVar262 * 4.0;
        auVar64._28_4_ = auVar117._28_4_;
        auVar266 = vsubps_avx(auVar50,auVar64);
        _local_8a0 = vcmpps_avx(auVar266,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar117 = _local_8a0;
        if ((((((((_local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_8a0 >> 0x7f,0) == '\0') &&
              (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_8a0 >> 0xbf,0) == '\0') &&
            (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8a0[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_660 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar240 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar171 = ZEXT864(0) << 0x20;
          auVar231 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          _local_8a0 = auVar160;
          local_640 = local_660;
        }
        else {
          auVar229 = vsqrtps_avx(auVar266);
          auVar239._0_4_ = fVar214 + fVar214;
          auVar239._4_4_ = fVar282 + fVar282;
          auVar239._8_4_ = fVar215 + fVar215;
          auVar239._12_4_ = fVar216 + fVar216;
          auVar239._16_4_ = fVar217 + fVar217;
          auVar239._20_4_ = fVar218 + fVar218;
          auVar239._24_4_ = fVar262 + fVar262;
          auVar239._28_4_ = fVar197 + fVar197;
          auVar240 = vrcpps_avx(auVar239);
          auVar113 = vfnmadd213ps_fma(auVar239,auVar240,auVar164);
          auVar113 = vfmadd132ps_fma(ZEXT1632(auVar113),auVar240,auVar240);
          auVar268._0_4_ = (uint)auVar162._0_4_ ^ local_620;
          auVar268._4_4_ = (uint)auVar162._4_4_ ^ uStack_61c;
          auVar268._8_4_ = (uint)auVar162._8_4_ ^ uStack_618;
          auVar268._12_4_ = (uint)auVar162._12_4_ ^ uStack_614;
          auVar268._16_4_ = (uint)auVar162._16_4_ ^ (uint)fStack_610;
          auVar268._20_4_ = (uint)auVar162._20_4_ ^ (uint)fStack_60c;
          auVar268._24_4_ = (uint)auVar162._24_4_ ^ (uint)fStack_608;
          auVar268._28_4_ = (uint)auVar162._28_4_ ^ uStack_604;
          auVar240 = vsubps_avx(auVar268,auVar229);
          auVar19 = vsubps_avx(auVar229,auVar162);
          fVar197 = auVar240._0_4_ * auVar113._0_4_;
          fVar214 = auVar240._4_4_ * auVar113._4_4_;
          auVar65._4_4_ = fVar214;
          auVar65._0_4_ = fVar197;
          fVar282 = auVar240._8_4_ * auVar113._8_4_;
          auVar65._8_4_ = fVar282;
          fVar215 = auVar240._12_4_ * auVar113._12_4_;
          auVar65._12_4_ = fVar215;
          fVar216 = auVar240._16_4_ * 0.0;
          auVar65._16_4_ = fVar216;
          fVar217 = auVar240._20_4_ * 0.0;
          auVar65._20_4_ = fVar217;
          fVar218 = auVar240._24_4_ * 0.0;
          auVar65._24_4_ = fVar218;
          auVar65._28_4_ = auVar229._28_4_;
          fVar262 = auVar19._0_4_ * auVar113._0_4_;
          fVar173 = auVar19._4_4_ * auVar113._4_4_;
          auVar66._4_4_ = fVar173;
          auVar66._0_4_ = fVar262;
          fVar174 = auVar19._8_4_ * auVar113._8_4_;
          auVar66._8_4_ = fVar174;
          fVar244 = auVar19._12_4_ * auVar113._12_4_;
          auVar66._12_4_ = fVar244;
          fVar251 = auVar19._16_4_ * 0.0;
          auVar66._16_4_ = fVar251;
          fVar252 = auVar19._20_4_ * 0.0;
          auVar66._20_4_ = fVar252;
          fVar253 = auVar19._24_4_ * 0.0;
          auVar66._24_4_ = fVar253;
          auVar66._28_4_ = auVar240._28_4_;
          auVar113 = vfmadd213ps_fma(auVar228,auVar65,auVar233);
          auVar108 = vfmadd213ps_fma(auVar228,auVar66,auVar233);
          auVar240 = ZEXT1632(CONCAT412(fVar283 * auVar113._12_4_,
                                        CONCAT48(fVar279 * auVar113._8_4_,
                                                 CONCAT44(fVar213 * auVar113._4_4_,
                                                          fVar212 * auVar113._0_4_))));
          auVar229 = ZEXT1632(CONCAT412(fVar283 * auVar108._12_4_,
                                        CONCAT48(fVar279 * auVar108._8_4_,
                                                 CONCAT44(fVar213 * auVar108._4_4_,
                                                          fVar212 * auVar108._0_4_))));
          auVar113 = vfmadd213ps_fma(auVar17,auVar240,auVar161);
          auVar108 = vfmadd213ps_fma(auVar17,auVar229,auVar161);
          auVar271 = vfmadd213ps_fma(auVar120,auVar240,local_820);
          auVar4 = vfmadd213ps_fma(auVar120,auVar229,local_820);
          auVar246 = vfmadd213ps_fma(auVar240,auVar18,local_a80);
          auVar5 = vfmadd213ps_fma(auVar18,auVar229,local_a80);
          auVar67._4_4_ = (float)local_560._4_4_ * fVar214;
          auVar67._0_4_ = (float)local_560._0_4_ * fVar197;
          auVar67._8_4_ = fStack_558 * fVar282;
          auVar67._12_4_ = fStack_554 * fVar215;
          auVar67._16_4_ = fStack_550 * fVar216;
          auVar67._20_4_ = fStack_54c * fVar217;
          auVar67._24_4_ = fStack_548 * fVar218;
          auVar67._28_4_ = 0;
          auVar120 = vsubps_avx(auVar67,ZEXT1632(auVar113));
          auVar88._4_4_ = (float)local_7a0._4_4_ * fVar214;
          auVar88._0_4_ = (float)local_7a0._0_4_ * fVar197;
          auVar88._8_4_ = fStack_798 * fVar282;
          auVar88._12_4_ = fStack_794 * fVar215;
          auVar88._16_4_ = fStack_790 * fVar216;
          auVar88._20_4_ = fStack_78c * fVar217;
          auVar88._24_4_ = fStack_788 * fVar218;
          auVar88._28_4_ = fVar172;
          auVar240 = vsubps_avx(auVar88,ZEXT1632(auVar271));
          auVar165._0_4_ = local_600 * fVar197;
          auVar165._4_4_ = fStack_5fc * fVar214;
          auVar165._8_4_ = fStack_5f8 * fVar282;
          auVar165._12_4_ = fStack_5f4 * fVar215;
          auVar165._16_4_ = fStack_5f0 * fVar216;
          auVar165._20_4_ = fStack_5ec * fVar217;
          auVar165._24_4_ = fStack_5e8 * fVar218;
          auVar165._28_4_ = 0;
          auVar17 = vsubps_avx(auVar165,ZEXT1632(auVar246));
          auVar171 = ZEXT3264(auVar17);
          auVar241._0_4_ = (float)local_560._0_4_ * fVar262;
          auVar241._4_4_ = (float)local_560._4_4_ * fVar173;
          auVar241._8_4_ = fStack_558 * fVar174;
          auVar241._12_4_ = fStack_554 * fVar244;
          auVar241._16_4_ = fStack_550 * fVar251;
          auVar241._20_4_ = fStack_54c * fVar252;
          auVar241._24_4_ = fStack_548 * fVar253;
          auVar241._28_4_ = 0;
          local_640 = vsubps_avx(auVar241,ZEXT1632(auVar108));
          auVar68._4_4_ = (float)local_7a0._4_4_ * fVar173;
          auVar68._0_4_ = (float)local_7a0._0_4_ * fVar262;
          auVar68._8_4_ = fStack_798 * fVar174;
          auVar68._12_4_ = fStack_794 * fVar244;
          auVar68._16_4_ = fStack_790 * fVar251;
          auVar68._20_4_ = fStack_78c * fVar252;
          auVar68._24_4_ = fStack_788 * fVar253;
          auVar68._28_4_ = local_640._28_4_;
          local_660 = vsubps_avx(auVar68,ZEXT1632(auVar4));
          auVar69._4_4_ = fStack_5fc * fVar173;
          auVar69._0_4_ = local_600 * fVar262;
          auVar69._8_4_ = fStack_5f8 * fVar174;
          auVar69._12_4_ = fStack_5f4 * fVar244;
          auVar69._16_4_ = fStack_5f0 * fVar251;
          auVar69._20_4_ = fStack_5ec * fVar252;
          auVar69._24_4_ = fStack_5e8 * fVar253;
          auVar69._28_4_ = local_660._28_4_;
          _local_680 = vsubps_avx(auVar69,ZEXT1632(auVar5));
          auVar18 = vcmpps_avx(auVar266,_DAT_01faff00,5);
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar17 = vblendvps_avx(auVar242,auVar65,auVar18);
          auVar231 = ZEXT3264(auVar17);
          auVar266 = vandps_avx(local_7c0,auVar49);
          auVar266 = vmaxps_avx(local_480,auVar266);
          auVar70._4_4_ = auVar266._4_4_ * 1.9073486e-06;
          auVar70._0_4_ = auVar266._0_4_ * 1.9073486e-06;
          auVar70._8_4_ = auVar266._8_4_ * 1.9073486e-06;
          auVar70._12_4_ = auVar266._12_4_ * 1.9073486e-06;
          auVar70._16_4_ = auVar266._16_4_ * 1.9073486e-06;
          auVar70._20_4_ = auVar266._20_4_ * 1.9073486e-06;
          auVar70._24_4_ = auVar266._24_4_ * 1.9073486e-06;
          auVar70._28_4_ = auVar266._28_4_;
          auVar266 = vandps_avx(local_7c0,local_960);
          auVar266 = vcmpps_avx(auVar266,auVar70,1);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar238 = vblendvps_avx(auVar243,auVar66,auVar18);
          auVar229 = auVar18 & auVar266;
          if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar229 >> 0x7f,0) != '\0') ||
                (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar229 >> 0xbf,0) != '\0') ||
              (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar229[0x1f] < '\0') {
            auVar117 = vandps_avx(auVar266,auVar18);
            auVar266 = vcmpps_avx(auVar278,ZEXT832(0) << 0x20,2);
            auVar269._8_4_ = 0xff800000;
            auVar269._0_8_ = 0xff800000ff800000;
            auVar269._12_4_ = 0xff800000;
            auVar269._16_4_ = 0xff800000;
            auVar269._20_4_ = 0xff800000;
            auVar269._24_4_ = 0xff800000;
            auVar269._28_4_ = 0xff800000;
            auVar276._8_4_ = 0x7f800000;
            auVar276._0_8_ = 0x7f8000007f800000;
            auVar276._12_4_ = 0x7f800000;
            auVar276._16_4_ = 0x7f800000;
            auVar276._20_4_ = 0x7f800000;
            auVar276._24_4_ = 0x7f800000;
            auVar276._28_4_ = 0x7f800000;
            auVar278 = vblendvps_avx(auVar276,auVar269,auVar266);
            auVar113 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
            auVar229 = vpmovsxwd_avx2(auVar113);
            auVar278 = vblendvps_avx(auVar17,auVar278,auVar229);
            auVar231 = ZEXT3264(auVar278);
            auVar278 = vblendvps_avx(auVar269,auVar276,auVar266);
            auVar238 = vblendvps_avx(auVar238,auVar278,auVar229);
            auVar226._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
            auVar226._8_4_ = auVar117._8_4_ ^ 0xffffffff;
            auVar226._12_4_ = auVar117._12_4_ ^ 0xffffffff;
            auVar226._16_4_ = auVar117._16_4_ ^ 0xffffffff;
            auVar226._20_4_ = auVar117._20_4_ ^ 0xffffffff;
            auVar226._24_4_ = auVar117._24_4_ ^ 0xffffffff;
            auVar226._28_4_ = auVar117._28_4_ ^ 0xffffffff;
            auVar117 = vorps_avx(auVar266,auVar226);
            auVar117 = vandps_avx(auVar18,auVar117);
          }
        }
        auVar270 = ZEXT3264(_local_880);
        uVar102 = *(undefined4 *)&(ray->dir).field_0;
        auVar249._4_4_ = uVar102;
        auVar249._0_4_ = uVar102;
        auVar249._8_4_ = uVar102;
        auVar249._12_4_ = uVar102;
        auVar249._16_4_ = uVar102;
        auVar249._20_4_ = uVar102;
        auVar249._24_4_ = uVar102;
        auVar249._28_4_ = uVar102;
        auVar250 = ZEXT3264(auVar249);
        uVar102 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        local_860._4_4_ = uVar102;
        local_860._0_4_ = uVar102;
        local_860._8_4_ = uVar102;
        local_860._12_4_ = uVar102;
        local_860._16_4_ = uVar102;
        local_860._20_4_ = uVar102;
        local_860._24_4_ = uVar102;
        local_860._28_4_ = uVar102;
        fVar197 = (ray->dir).field_0.m128[2];
        local_a60._4_4_ = fVar197;
        local_a60._0_4_ = fVar197;
        local_a60._8_4_ = fVar197;
        local_a60._12_4_ = fVar197;
        local_a60._16_4_ = fVar197;
        local_a60._20_4_ = fVar197;
        local_a60._24_4_ = fVar197;
        local_a60._28_4_ = fVar197;
        auVar261 = ZEXT3264(local_a60);
        local_4c0 = _local_880;
        local_4a0 = vminps_avx(local_4e0,auVar231._0_32_);
        local_6a0 = vmaxps_avx(_local_880,auVar238);
        auVar259 = ZEXT3264(local_6a0);
        local_500 = local_6a0;
        auVar278 = vcmpps_avx(_local_880,local_4a0,2);
        local_580 = vandps_avx(auVar278,auVar147);
        auVar278 = vcmpps_avx(local_6a0,local_4e0,2);
        auVar147 = vandps_avx(auVar278,auVar147);
        auVar278 = vorps_avx(auVar147,local_580);
        if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar278 >> 0x7f,0) != '\0') ||
              (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar278 >> 0xbf,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar278[0x1f] < '\0') {
          local_5e0 = (undefined1  [8])(auVar117._0_8_ ^ 0xffffffffffffffff);
          register0x000012c8 = auVar117._8_4_ ^ 0xffffffff;
          register0x000012cc = auVar117._12_4_ ^ 0xffffffff;
          register0x000012d0 = auVar117._16_4_ ^ 0xffffffff;
          register0x000012d4 = auVar117._20_4_ ^ 0xffffffff;
          register0x000012d8 = auVar117._24_4_ ^ 0xffffffff;
          uStack_5c4 = auVar117._28_4_ ^ 0xffffffff;
          auVar250._0_4_ = fVar197 * auVar171._0_4_;
          auVar250._4_4_ = fVar197 * auVar171._4_4_;
          auVar250._8_4_ = fVar197 * auVar171._8_4_;
          auVar250._12_4_ = fVar197 * auVar171._12_4_;
          auVar250._16_4_ = fVar197 * auVar171._16_4_;
          auVar250._20_4_ = fVar197 * auVar171._20_4_;
          auVar250._28_36_ = auVar171._28_36_;
          auVar250._24_4_ = fVar197 * auVar171._24_4_;
          auVar113 = vfmadd213ps_fma(auVar240,local_860,auVar250._0_32_);
          auVar113 = vfmadd213ps_fma(auVar120,auVar249,ZEXT1632(auVar113));
          auVar117 = vandps_avx(ZEXT1632(auVar113),local_7c0);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar117 = vcmpps_avx(auVar117,auVar145,1);
          auVar117 = vorps_avx(auVar117,_local_5e0);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar117 = vblendvps_avx(auVar166,auVar146,auVar117);
          local_300._4_4_ = local_ae4;
          local_300._0_4_ = local_ae4;
          local_300._8_4_ = local_ae4;
          local_300._12_4_ = local_ae4;
          local_300._16_4_ = local_ae4;
          local_300._20_4_ = local_ae4;
          local_300._24_4_ = local_ae4;
          local_300._28_4_ = local_ae4;
          local_5a0 = vpcmpgtd_avx2(auVar117,local_300);
          local_540 = vpandn_avx2(local_5a0,local_580);
          auVar250 = ZEXT3264(local_540);
          auVar117 = local_580 & ~local_5a0;
          _local_5c0 = auVar147;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar117 >> 0x7f,0) == '\0') &&
                (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0xbf,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar117[0x1f]) {
            fVar197 = ray->tfar;
            auVar124._4_4_ = fVar197;
            auVar124._0_4_ = fVar197;
            auVar124._8_4_ = fVar197;
            auVar124._12_4_ = fVar197;
            auVar124._16_4_ = fVar197;
            auVar124._20_4_ = fVar197;
            auVar124._24_4_ = fVar197;
            auVar124._28_4_ = fVar197;
            auVar278 = local_860;
            local_860 = auVar232;
            unique0x10013a0f = local_840._16_16_;
          }
          else {
            local_320 = auVar249;
            auVar108 = vminps_avx(local_9c0,local_9e0);
            auVar113 = vmaxps_avx(local_9c0,local_9e0);
            auVar271 = vminps_avx(local_9d0,_local_9f0);
            auVar4 = vminps_avx(auVar108,auVar271);
            auVar108 = vmaxps_avx(local_9d0,_local_9f0);
            auVar271 = vmaxps_avx(auVar113,auVar108);
            auVar176._8_4_ = 0x7fffffff;
            auVar176._0_8_ = 0x7fffffff7fffffff;
            auVar176._12_4_ = 0x7fffffff;
            auVar113 = vandps_avx(auVar4,auVar176);
            local_780._0_16_ = auVar176;
            auVar108 = vandps_avx(auVar271,auVar176);
            auVar113 = vmaxps_avx(auVar113,auVar108);
            auVar108 = vmovshdup_avx(auVar113);
            auVar108 = vmaxss_avx(auVar108,auVar113);
            auVar113 = vshufpd_avx(auVar113,auVar113,1);
            auVar113 = vmaxss_avx(auVar113,auVar108);
            local_960._0_4_ = auVar113._0_4_ * 1.9073486e-06;
            local_980._0_16_ = vshufps_avx(auVar271,auVar271,0xff);
            local_980._16_16_ = auVar16._16_16_;
            local_760._4_4_ = (float)local_aa0._4_4_ + (float)local_880._4_4_;
            local_760._0_4_ = (float)local_aa0._0_4_ + (float)local_880._0_4_;
            fStack_758 = fStack_a98 + fStack_878;
            fStack_754 = fStack_a94 + fStack_874;
            fStack_750 = fStack_a90 + fStack_870;
            fStack_74c = fStack_a8c + fStack_86c;
            fStack_748 = fStack_a88 + fStack_868;
            fStack_744 = fStack_a84 + fStack_864;
            do {
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar147 = auVar250._0_32_;
              auVar117 = vblendvps_avx(auVar125,_local_880,auVar147);
              auVar278 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar278 = vminps_avx(auVar117,auVar278);
              auVar266 = vshufpd_avx(auVar278,auVar278,5);
              auVar278 = vminps_avx(auVar278,auVar266);
              auVar266 = vpermpd_avx2(auVar278,0x4e);
              auVar278 = vminps_avx(auVar278,auVar266);
              auVar117 = vcmpps_avx(auVar117,auVar278,0);
              auVar278 = auVar147 & auVar117;
              if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar278 >> 0x7f,0) != '\0') ||
                    (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar278 >> 0xbf,0) != '\0') ||
                  (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar278[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar117,auVar147);
              }
              uVar93 = vmovmskps_avx(auVar147);
              iVar20 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              uVar94 = iVar20 << 2;
              *(undefined4 *)(local_540 + uVar94) = 0;
              aVar2 = (ray->dir).field_0;
              local_820._0_16_ = (undefined1  [16])aVar2;
              auVar113 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar93 = *(uint *)(local_1a0 + uVar94);
              if (auVar113._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_4c0 + uVar94));
                fVar197 = sqrtf(auVar113._0_4_);
                auVar113 = local_a80._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar197 = auVar113._0_4_;
                auVar113 = ZEXT416(*(uint *)(local_4c0 + uVar94));
              }
              local_800._0_4_ = fVar197 * 1.9073486e-06;
              auVar113 = vinsertps_avx(auVar113,ZEXT416(uVar93),0x10);
              bVar100 = true;
              uVar96 = 0;
              do {
                local_920._0_16_ = vmovshdup_avx(auVar113);
                fVar212 = local_920._0_4_;
                fVar282 = 1.0 - fVar212;
                fVar214 = fVar282 * fVar282 * fVar282;
                fVar279 = fVar212 * fVar212;
                fVar213 = fVar212 * fVar279;
                auVar271 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar213));
                fVar197 = fVar212 * fVar282;
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar197 * 6.0)),
                                         ZEXT416((uint)(fVar282 * fVar197)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar246 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar197 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar212 * fVar197)));
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                           ZEXT416((uint)fVar214));
                fVar212 = (auVar108._0_4_ + auVar246._0_4_) * 0.16666667;
                fVar213 = fVar213 * 0.16666667;
                auVar135._0_4_ = fVar213 * (float)local_9f0._0_4_;
                auVar135._4_4_ = fVar213 * (float)local_9f0._4_4_;
                auVar135._8_4_ = fVar213 * fStack_9e8;
                auVar135._12_4_ = fVar213 * fStack_9e4;
                auVar177._4_4_ = fVar212;
                auVar177._0_4_ = fVar212;
                auVar177._8_4_ = fVar212;
                auVar177._12_4_ = fVar212;
                auVar108 = vfmadd132ps_fma(auVar177,auVar135,local_9d0);
                fVar212 = (auVar271._0_4_ + auVar4._0_4_) * 0.16666667;
                auVar136._4_4_ = fVar212;
                auVar136._0_4_ = fVar212;
                auVar136._8_4_ = fVar212;
                auVar136._12_4_ = fVar212;
                auVar108 = vfmadd132ps_fma(auVar136,auVar108,local_9e0);
                fVar212 = auVar113._0_4_;
                auVar152._4_4_ = fVar212;
                auVar152._0_4_ = fVar212;
                auVar152._8_4_ = fVar212;
                auVar152._12_4_ = fVar212;
                auVar271 = vfmadd213ps_fma(auVar152,local_820._0_16_,_DAT_01f7aa10);
                fVar214 = fVar214 * 0.16666667;
                auVar107._4_4_ = fVar214;
                auVar107._0_4_ = fVar214;
                auVar107._8_4_ = fVar214;
                auVar107._12_4_ = fVar214;
                auVar108 = vfmadd132ps_fma(auVar107,auVar108,local_9c0);
                local_6e0._0_16_ = auVar108;
                auVar108 = vsubps_avx(auVar271,auVar108);
                _local_8a0 = auVar108;
                auVar108 = vdpps_avx(auVar108,auVar108,0x7f);
                local_a80._0_16_ = auVar108;
                if (auVar108._0_4_ < 0.0) {
                  local_940._0_16_ = ZEXT416((uint)fVar282);
                  local_a20._0_4_ = fVar279;
                  local_a40._0_4_ = fVar197;
                  auVar270._0_4_ = sqrtf(auVar108._0_4_);
                  auVar270._4_60_ = extraout_var;
                  auVar108 = auVar270._0_16_;
                  fVar197 = (float)local_a40._0_4_;
                  fVar279 = (float)local_a20._0_4_;
                  auVar271 = local_940._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar108,auVar108);
                  auVar271 = ZEXT416((uint)fVar282);
                }
                fVar213 = auVar271._0_4_;
                auVar109._4_4_ = fVar213;
                auVar109._0_4_ = fVar213;
                auVar109._8_4_ = fVar213;
                auVar109._12_4_ = fVar213;
                auVar246 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                            ZEXT416((uint)(fVar197 * 4.0)));
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * 4.0)),auVar271,auVar271);
                fVar197 = fVar213 * -fVar213 * 0.5;
                fVar213 = auVar246._0_4_ * 0.5;
                fVar214 = auVar4._0_4_ * 0.5;
                fVar279 = fVar279 * 0.5;
                auVar221._0_4_ = (float)local_9f0._0_4_ * fVar279;
                auVar221._4_4_ = (float)local_9f0._4_4_ * fVar279;
                auVar221._8_4_ = fStack_9e8 * fVar279;
                auVar221._12_4_ = fStack_9e4 * fVar279;
                auVar178._4_4_ = fVar214;
                auVar178._0_4_ = fVar214;
                auVar178._8_4_ = fVar214;
                auVar178._12_4_ = fVar214;
                auVar4 = vfmadd213ps_fma(auVar178,local_9d0,auVar221);
                auVar199._4_4_ = fVar213;
                auVar199._0_4_ = fVar213;
                auVar199._8_4_ = fVar213;
                auVar199._12_4_ = fVar213;
                auVar4 = vfmadd213ps_fma(auVar199,local_9e0,auVar4);
                auVar257._4_4_ = fVar197;
                auVar257._0_4_ = fVar197;
                auVar257._8_4_ = fVar197;
                auVar257._12_4_ = fVar197;
                auVar5 = vfmadd213ps_fma(auVar257,local_9c0,auVar4);
                auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar271,local_920._0_16_);
                auVar7 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar271);
                auVar270 = ZEXT1664(auVar7);
                auVar271 = vshufps_avx(auVar113,auVar113,0x55);
                auVar179._0_4_ = (float)local_9f0._0_4_ * auVar271._0_4_;
                auVar179._4_4_ = (float)local_9f0._4_4_ * auVar271._4_4_;
                auVar179._8_4_ = fStack_9e8 * auVar271._8_4_;
                auVar179._12_4_ = fStack_9e4 * auVar271._12_4_;
                uVar102 = auVar7._0_4_;
                auVar200._4_4_ = uVar102;
                auVar200._0_4_ = uVar102;
                auVar200._8_4_ = uVar102;
                auVar200._12_4_ = uVar102;
                auVar271 = vfmadd213ps_fma(auVar200,local_9d0,auVar179);
                auVar153._0_4_ = auVar4._0_4_;
                auVar153._4_4_ = auVar153._0_4_;
                auVar153._8_4_ = auVar153._0_4_;
                auVar153._12_4_ = auVar153._0_4_;
                auVar271 = vfmadd213ps_fma(auVar153,local_9e0,auVar271);
                auVar6 = vfmadd231ps_fma(auVar271,local_9c0,auVar109);
                auVar4 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar271 = vblendps_avx(auVar4,_DAT_01f7aa10,0xe);
                auVar246 = vrsqrtss_avx(auVar271,auVar271);
                fVar197 = auVar246._0_4_;
                fVar214 = auVar4._0_4_;
                fVar197 = fVar197 * 1.5 + fVar214 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar246 = vdpps_avx(auVar5,auVar6,0x7f);
                auVar154._0_4_ = auVar6._0_4_ * fVar214;
                auVar154._4_4_ = auVar6._4_4_ * fVar214;
                auVar154._8_4_ = auVar6._8_4_ * fVar214;
                auVar154._12_4_ = auVar6._12_4_ * fVar214;
                fVar213 = auVar246._0_4_;
                auVar222._0_4_ = auVar5._0_4_ * fVar213;
                auVar222._4_4_ = auVar5._4_4_ * fVar213;
                fVar279 = auVar5._8_4_;
                auVar222._8_4_ = fVar279 * fVar213;
                fVar282 = auVar5._12_4_;
                auVar222._12_4_ = fVar282 * fVar213;
                auVar246 = vsubps_avx(auVar154,auVar222);
                auVar271 = vrcpss_avx(auVar271,auVar271);
                auVar6 = vfnmadd213ss_fma(auVar271,auVar4,ZEXT416(0x40000000));
                fVar213 = auVar271._0_4_ * auVar6._0_4_;
                auVar271 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar212 * (float)local_800._0_4_)));
                auVar261 = ZEXT1664(auVar271);
                auVar245._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = -fVar279;
                auVar245._12_4_ = -fVar282;
                local_840._0_4_ = fVar197 * auVar246._0_4_ * fVar213;
                local_840._4_4_ = fVar197 * auVar246._4_4_ * fVar213;
                local_840._8_4_ = fVar197 * auVar246._8_4_ * fVar213;
                local_840._12_4_ = fVar197 * auVar246._12_4_ * fVar213;
                local_920._0_16_ = auVar5;
                local_8c0._0_4_ = auVar5._0_4_ * fVar197;
                local_8c0._4_4_ = auVar5._4_4_ * fVar197;
                local_8c0._8_4_ = fVar279 * fVar197;
                local_8c0._12_4_ = fVar282 * fVar197;
                local_940._0_4_ = auVar271._0_4_;
                if (fVar214 < -fVar214) {
                  local_a20._0_4_ = auVar108._0_4_;
                  local_a40._0_16_ = auVar245;
                  auVar270 = ZEXT1664(auVar7);
                  fVar197 = sqrtf(fVar214);
                  auVar261 = ZEXT464((uint)local_940._0_4_);
                  auVar108 = ZEXT416((uint)local_a20._0_4_);
                  auVar245 = local_a40._0_16_;
                }
                else {
                  auVar271 = vsqrtss_avx(auVar4,auVar4);
                  fVar197 = auVar271._0_4_;
                }
                local_a20._0_16_ = vdpps_avx(_local_8a0,local_8c0._0_16_,0x7f);
                auVar231 = ZEXT1664(local_a20._0_16_);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar108,auVar261._0_16_);
                auVar271 = vdpps_avx(auVar245,local_8c0._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_8a0,local_840._0_16_,0x7f);
                auVar246 = vdpps_avx(local_820._0_16_,local_8c0._0_16_,0x7f);
                auVar108 = vfmadd213ss_fma(ZEXT416((uint)(auVar108._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar197)),auVar5)
                ;
                local_a40._0_4_ = auVar108._0_4_;
                auVar110._0_4_ = local_a20._0_4_ * local_a20._0_4_;
                auVar110._4_4_ = local_a20._4_4_ * local_a20._4_4_;
                auVar110._8_4_ = local_a20._8_4_ * local_a20._8_4_;
                auVar110._12_4_ = local_a20._12_4_ * local_a20._12_4_;
                auVar108 = vdpps_avx(_local_8a0,auVar245,0x7f);
                auVar6 = vsubps_avx(local_a80._0_16_,auVar110);
                auVar5 = vrsqrtss_avx(auVar6,auVar6);
                fVar212 = auVar6._0_4_;
                fVar197 = auVar5._0_4_;
                fVar197 = fVar197 * 1.5 + fVar212 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar5 = vdpps_avx(_local_8a0,local_820._0_16_,0x7f);
                local_8c0._0_16_ = ZEXT416((uint)(auVar271._0_4_ + auVar4._0_4_));
                local_840._0_16_ = vfnmadd231ss_fma(auVar108,local_a20._0_16_,local_8c0._0_16_);
                auVar108 = vfnmadd231ss_fma(auVar5,local_a20._0_16_,auVar246);
                if (fVar212 < 0.0) {
                  local_700._0_16_ = auVar246;
                  local_720._0_4_ = fVar197;
                  local_740._0_16_ = auVar108;
                  auVar231 = ZEXT1664(local_a20._0_16_);
                  auVar270 = ZEXT1664(auVar270._0_16_);
                  fVar212 = sqrtf(fVar212);
                  auVar261 = ZEXT464((uint)local_940._0_4_);
                  fVar197 = (float)local_720._0_4_;
                  auVar108 = local_740._0_16_;
                  auVar246 = local_700._0_16_;
                }
                else {
                  auVar271 = vsqrtss_avx(auVar6,auVar6);
                  fVar212 = auVar271._0_4_;
                }
                auVar259 = ZEXT1664(local_a80._0_16_);
                auVar271 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar212 = fVar212 - auVar271._0_4_;
                auVar4 = vpermilps_avx(local_920._0_16_,0xff);
                auVar271 = vfmsub213ss_fma(local_840._0_16_,ZEXT416((uint)fVar197),auVar4);
                auVar180._0_8_ = auVar246._0_8_ ^ 0x8000000080000000;
                auVar180._8_4_ = auVar246._8_4_ ^ 0x80000000;
                auVar180._12_4_ = auVar246._12_4_ ^ 0x80000000;
                auVar201._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar271._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar271._12_4_ ^ 0x80000000;
                auVar108 = ZEXT416((uint)(auVar108._0_4_ * fVar197));
                auVar271 = vfmsub231ss_fma(ZEXT416((uint)(auVar246._0_4_ * auVar271._0_4_)),
                                           local_8c0._0_16_,auVar108);
                auVar108 = vinsertps_avx(auVar201,auVar108,0x1c);
                uVar102 = auVar271._0_4_;
                auVar202._4_4_ = uVar102;
                auVar202._0_4_ = uVar102;
                auVar202._8_4_ = uVar102;
                auVar202._12_4_ = uVar102;
                auVar108 = vdivps_avx(auVar108,auVar202);
                auVar271 = vinsertps_avx(local_8c0._0_16_,auVar180,0x10);
                auVar271 = vdivps_avx(auVar271,auVar202);
                fVar197 = local_a20._0_4_;
                auVar155._0_4_ = fVar197 * auVar108._0_4_ + fVar212 * auVar271._0_4_;
                auVar155._4_4_ = fVar197 * auVar108._4_4_ + fVar212 * auVar271._4_4_;
                auVar155._8_4_ = fVar197 * auVar108._8_4_ + fVar212 * auVar271._8_4_;
                auVar155._12_4_ = fVar197 * auVar108._12_4_ + fVar212 * auVar271._12_4_;
                auVar113 = vsubps_avx(auVar113,auVar155);
                auVar108 = vandps_avx(local_a20._0_16_,local_780._0_16_);
                fVar101 = (float)local_aa0._0_4_;
                fVar127 = (float)local_aa0._4_4_;
                fVar128 = fStack_a98;
                fVar129 = fStack_a94;
                fVar130 = fStack_a90;
                fVar131 = fStack_a8c;
                fVar132 = fStack_a88;
                fVar149 = fStack_a84;
                if (auVar108._0_4_ < (float)local_a40._0_4_) {
                  auVar271 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + (float)local_a40._0_4_)
                                                    ),local_980._0_16_,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(ZEXT416((uint)fVar212),local_780._0_16_);
                  if (auVar108._0_4_ < auVar271._0_4_) {
                    fVar197 = auVar113._0_4_ + (float)local_7e0._0_4_;
                    bVar89 = 0;
                    if (((ray->org).field_0.m128[3] <= fVar197) &&
                       (fVar212 = ray->tfar, bVar89 = 0, fVar197 <= fVar212)) {
                      auVar113 = vmovshdup_avx(auVar113);
                      bVar89 = 0;
                      fVar213 = auVar113._0_4_;
                      if ((0.0 <= fVar213) && (fVar213 <= 1.0)) {
                        auVar113 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                        fVar214 = auVar113._0_4_;
                        pGVar10 = (context->scene->geometries).items[uVar91].ptr;
                        if ((pGVar10->mask & ray->mask) == 0) {
                          bVar89 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar89 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0))
                        {
                          fVar214 = fVar214 * 1.5 +
                                    local_a80._0_4_ * -0.5 * fVar214 * fVar214 * fVar214;
                          auVar181._0_4_ = fVar214 * (float)local_8a0._0_4_;
                          auVar181._4_4_ = fVar214 * (float)local_8a0._4_4_;
                          auVar181._8_4_ = fVar214 * fStack_898;
                          auVar181._12_4_ = fVar214 * fStack_894;
                          auVar4 = vfmadd213ps_fma(auVar4,auVar181,local_920._0_16_);
                          auVar113 = vshufps_avx(auVar181,auVar181,0xc9);
                          auVar108 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                          auVar182._0_4_ = auVar181._0_4_ * auVar108._0_4_;
                          auVar182._4_4_ = auVar181._4_4_ * auVar108._4_4_;
                          auVar182._8_4_ = auVar181._8_4_ * auVar108._8_4_;
                          auVar182._12_4_ = auVar181._12_4_ * auVar108._12_4_;
                          auVar271 = vfmsub231ps_fma(auVar182,local_920._0_16_,auVar113);
                          auVar113 = vshufps_avx(auVar271,auVar271,0xc9);
                          auVar108 = vshufps_avx(auVar4,auVar4,0xc9);
                          auVar271 = vshufps_avx(auVar271,auVar271,0xd2);
                          auVar111._0_4_ = auVar4._0_4_ * auVar271._0_4_;
                          auVar111._4_4_ = auVar4._4_4_ * auVar271._4_4_;
                          auVar111._8_4_ = auVar4._8_4_ * auVar271._8_4_;
                          auVar111._12_4_ = auVar4._12_4_ * auVar271._12_4_;
                          auVar108 = vfmsub231ps_fma(auVar111,auVar113,auVar108);
                          auVar113 = vshufps_avx(auVar108,auVar108,0xe9);
                          local_900 = vmovlps_avx(auVar113);
                          local_8f8 = auVar108._0_4_;
                          local_8f0 = 0;
                          local_8ec = (undefined4)local_8c8;
                          local_8e4 = context->user->instID[0];
                          local_8e0 = context->user->instPrimID[0];
                          ray->tfar = fVar197;
                          local_6c0._0_4_ = 0xffffffff;
                          local_9b0.valid = (int *)local_6c0;
                          local_9b0.geometryUserPtr = pGVar10->userPtr;
                          local_9b0.context = context->user;
                          local_9b0.hit = (RTCHitN *)&local_900;
                          local_9b0.N = 1;
                          local_9b0.ray = (RTCRayN *)ray;
                          local_8f4 = fVar213;
                          local_8e8 = uVar91;
                          if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0189872c:
                            p_Var14 = context->args->filter;
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar231 = ZEXT1664(auVar231._0_16_);
                              auVar259 = ZEXT1664(auVar259._0_16_);
                              auVar270 = ZEXT1664(auVar270._0_16_);
                              (*p_Var14)(&local_9b0);
                              if (*local_9b0.valid == 0) goto LAB_01898770;
                            }
                            bVar89 = 1;
                          }
                          else {
                            auVar231 = ZEXT1664(auVar231._0_16_);
                            auVar259 = ZEXT1664(local_a80._0_16_);
                            auVar270 = ZEXT1664(auVar270._0_16_);
                            (*pGVar10->occlusionFilterN)(&local_9b0);
                            if (*local_9b0.valid != 0) goto LAB_0189872c;
LAB_01898770:
                            ray->tfar = fVar212;
                            bVar89 = 0;
                          }
                          fVar101 = (float)local_aa0._0_4_;
                          fVar127 = (float)local_aa0._4_4_;
                          fVar128 = fStack_a98;
                          fVar129 = fStack_a94;
                          fVar130 = fStack_a90;
                          fVar131 = fStack_a8c;
                          fVar132 = fStack_a88;
                          fVar149 = fStack_a84;
                        }
                      }
                    }
                    goto LAB_01898507;
                  }
                }
                bVar100 = uVar96 < 4;
                uVar96 = uVar96 + 1;
              } while (uVar96 != 5);
              bVar100 = false;
              bVar89 = 5;
LAB_01898507:
              auVar261 = ZEXT3264(local_a60);
              bVar97 = (bool)(bVar97 | bVar100 & bVar89);
              fVar197 = ray->tfar;
              auVar124._4_4_ = fVar197;
              auVar124._0_4_ = fVar197;
              auVar124._8_4_ = fVar197;
              auVar124._12_4_ = fVar197;
              auVar124._16_4_ = fVar197;
              auVar124._20_4_ = fVar197;
              auVar124._24_4_ = fVar197;
              auVar124._28_4_ = fVar197;
              auVar117 = vcmpps_avx(_local_760,auVar124,2);
              auVar147 = vandps_avx(auVar117,local_540);
              auVar250 = ZEXT3264(auVar147);
              auVar117 = local_540 & auVar117;
              auVar249 = local_320;
              auVar278 = local_860;
              local_540 = auVar147;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          auVar171._0_4_ = auVar261._0_4_ * (float)local_680._0_4_;
          auVar171._4_4_ = auVar261._4_4_ * (float)local_680._4_4_;
          auVar171._8_4_ = auVar261._8_4_ * fStack_678;
          auVar171._12_4_ = auVar261._12_4_ * fStack_674;
          auVar171._16_4_ = auVar261._16_4_ * fStack_670;
          auVar171._20_4_ = auVar261._20_4_ * fStack_66c;
          auVar171._28_36_ = auVar250._28_36_;
          auVar171._24_4_ = auVar261._24_4_ * fStack_668;
          auVar113 = vfmadd213ps_fma(local_660,auVar278,auVar171._0_32_);
          auVar113 = vfmadd213ps_fma(local_640,auVar249,ZEXT1632(auVar113));
          auVar147 = vandps_avx(ZEXT1632(auVar113),local_7c0);
          auVar167._8_4_ = 0x3e99999a;
          auVar167._0_8_ = 0x3e99999a3e99999a;
          auVar167._12_4_ = 0x3e99999a;
          auVar167._16_4_ = 0x3e99999a;
          auVar167._20_4_ = 0x3e99999a;
          auVar167._24_4_ = 0x3e99999a;
          auVar167._28_4_ = 0x3e99999a;
          auVar147 = vcmpps_avx(auVar147,auVar167,1);
          auVar117 = vorps_avx(auVar147,_local_5e0);
          auVar168._0_4_ = fVar101 + local_6a0._0_4_;
          auVar168._4_4_ = fVar127 + local_6a0._4_4_;
          auVar168._8_4_ = fVar128 + local_6a0._8_4_;
          auVar168._12_4_ = fVar129 + local_6a0._12_4_;
          auVar168._16_4_ = fVar130 + local_6a0._16_4_;
          auVar168._20_4_ = fVar131 + local_6a0._20_4_;
          auVar168._24_4_ = fVar132 + local_6a0._24_4_;
          auVar168._28_4_ = fVar149 + local_6a0._28_4_;
          auVar147 = vcmpps_avx(auVar168,auVar124,2);
          local_a60 = vandps_avx(auVar147,_local_5c0);
          auVar250 = ZEXT3264(local_a60);
          auVar169._8_4_ = 3;
          auVar169._0_8_ = 0x300000003;
          auVar169._12_4_ = 3;
          auVar169._16_4_ = 3;
          auVar169._20_4_ = 3;
          auVar169._24_4_ = 3;
          auVar169._28_4_ = 3;
          auVar195._8_4_ = 2;
          auVar195._0_8_ = 0x200000002;
          auVar195._12_4_ = 2;
          auVar195._16_4_ = 2;
          auVar195._20_4_ = 2;
          auVar195._24_4_ = 2;
          auVar195._28_4_ = 2;
          auVar147 = vblendvps_avx(auVar195,auVar169,auVar117);
          _local_760 = vpcmpgtd_avx2(auVar147,local_300);
          auVar147 = vpandn_avx2(_local_760,local_a60);
          auVar117 = local_a60 & ~_local_760;
          local_6c0 = auVar147;
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            auVar108 = vminps_avx(local_9c0,local_9e0);
            auVar113 = vmaxps_avx(local_9c0,local_9e0);
            auVar271 = vminps_avx(local_9d0,_local_9f0);
            auVar4 = vminps_avx(auVar108,auVar271);
            auVar108 = vmaxps_avx(local_9d0,_local_9f0);
            auVar171 = ZEXT3264(local_500);
            auVar271 = vmaxps_avx(auVar113,auVar108);
            local_840._8_4_ = NAN;
            local_840._0_8_ = 0x7fffffff7fffffff;
            local_840._12_4_ = NAN;
            auVar113 = vandps_avx(auVar4,local_840._0_16_);
            auVar108 = vandps_avx(auVar271,local_840._0_16_);
            auVar113 = vmaxps_avx(auVar113,auVar108);
            auVar108 = vmovshdup_avx(auVar113);
            auVar108 = vmaxss_avx(auVar108,auVar113);
            auVar113 = vshufpd_avx(auVar113,auVar113,1);
            auVar113 = vmaxss_avx(auVar113,auVar108);
            local_960._0_4_ = auVar113._0_4_ * 1.9073486e-06;
            local_740._0_16_ = vshufps_avx(auVar271,auVar271,0xff);
            local_880._4_4_ = fVar127 + local_500._4_4_;
            local_880._0_4_ = fVar101 + local_500._0_4_;
            fStack_878 = fVar128 + local_500._8_4_;
            fStack_874 = fVar129 + local_500._12_4_;
            fStack_870 = fVar130 + local_500._16_4_;
            fStack_86c = fVar131 + local_500._20_4_;
            fStack_868 = fVar132 + local_500._24_4_;
            fStack_864 = fVar149 + local_500._28_4_;
            local_980 = local_500;
            do {
              auVar126._8_4_ = 0x7f800000;
              auVar126._0_8_ = 0x7f8000007f800000;
              auVar126._12_4_ = 0x7f800000;
              auVar126._16_4_ = 0x7f800000;
              auVar126._20_4_ = 0x7f800000;
              auVar126._24_4_ = 0x7f800000;
              auVar126._28_4_ = 0x7f800000;
              auVar117 = vblendvps_avx(auVar126,auVar171._0_32_,auVar147);
              auVar278 = vshufps_avx(auVar117,auVar117,0xb1);
              auVar278 = vminps_avx(auVar117,auVar278);
              auVar266 = vshufpd_avx(auVar278,auVar278,5);
              auVar278 = vminps_avx(auVar278,auVar266);
              auVar266 = vpermpd_avx2(auVar278,0x4e);
              auVar278 = vminps_avx(auVar278,auVar266);
              auVar278 = vcmpps_avx(auVar117,auVar278,0);
              auVar266 = auVar147 & auVar278;
              auVar117 = auVar147;
              if ((((((((auVar266 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar266 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar266 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar266 >> 0x7f,0) != '\0') ||
                    (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar266 >> 0xbf,0) != '\0') ||
                  (auVar266 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar266[0x1f] < '\0') {
                auVar117 = vandps_avx(auVar278,auVar147);
              }
              uVar93 = vmovmskps_avx(auVar117);
              iVar20 = 0;
              for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              uVar94 = iVar20 << 2;
              local_6c0 = auVar147;
              *(undefined4 *)(local_6c0 + uVar94) = 0;
              aVar2 = (ray->dir).field_0;
              local_820._0_16_ = (undefined1  [16])aVar2;
              auVar113 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar93 = *(uint *)(local_1c0 + uVar94);
              if (auVar113._0_4_ < 0.0) {
                local_a80._0_16_ = ZEXT416(*(uint *)(local_4e0 + uVar94));
                fVar197 = sqrtf(auVar113._0_4_);
                auVar113 = local_a80._0_16_;
              }
              else {
                auVar113 = vsqrtss_avx(auVar113,auVar113);
                fVar197 = auVar113._0_4_;
                auVar113 = ZEXT416(*(uint *)(local_4e0 + uVar94));
              }
              local_780._0_4_ = fVar197 * 1.9073486e-06;
              auVar113 = vinsertps_avx(auVar113,ZEXT416(uVar93),0x10);
              auVar250 = ZEXT1664(auVar113);
              bVar100 = true;
              uVar96 = 0;
              do {
                auVar246 = auVar250._0_16_;
                local_920._0_16_ = vmovshdup_avx(auVar246);
                fVar212 = local_920._0_4_;
                fVar282 = 1.0 - fVar212;
                fVar214 = fVar282 * fVar282 * fVar282;
                fVar279 = fVar212 * fVar212;
                fVar213 = fVar212 * fVar279;
                auVar108 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar213));
                fVar197 = fVar212 * fVar282;
                auVar271 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * fVar197 * 6.0)),
                                           ZEXT416((uint)(fVar282 * fVar197)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar282 * fVar197 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar212 * fVar197)));
                auVar113 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                           ZEXT416((uint)fVar214));
                fVar212 = (auVar113._0_4_ + auVar4._0_4_) * 0.16666667;
                fVar213 = fVar213 * 0.16666667;
                auVar137._0_4_ = fVar213 * (float)local_9f0._0_4_;
                auVar137._4_4_ = fVar213 * (float)local_9f0._4_4_;
                auVar137._8_4_ = fVar213 * fStack_9e8;
                auVar137._12_4_ = fVar213 * fStack_9e4;
                auVar183._4_4_ = fVar212;
                auVar183._0_4_ = fVar212;
                auVar183._8_4_ = fVar212;
                auVar183._12_4_ = fVar212;
                auVar113 = vfmadd132ps_fma(auVar183,auVar137,local_9d0);
                fVar212 = (auVar108._0_4_ + auVar271._0_4_) * 0.16666667;
                auVar138._4_4_ = fVar212;
                auVar138._0_4_ = fVar212;
                auVar138._8_4_ = fVar212;
                auVar138._12_4_ = fVar212;
                auVar113 = vfmadd132ps_fma(auVar138,auVar113,local_9e0);
                fVar212 = auVar250._0_4_;
                auVar156._4_4_ = fVar212;
                auVar156._0_4_ = fVar212;
                auVar156._8_4_ = fVar212;
                auVar156._12_4_ = fVar212;
                auVar108 = vfmadd213ps_fma(auVar156,local_820._0_16_,_DAT_01f7aa10);
                fVar214 = fVar214 * 0.16666667;
                auVar112._4_4_ = fVar214;
                auVar112._0_4_ = fVar214;
                auVar112._8_4_ = fVar214;
                auVar112._12_4_ = fVar214;
                auVar113 = vfmadd132ps_fma(auVar112,auVar113,local_9c0);
                local_6e0._0_16_ = auVar113;
                auVar113 = vsubps_avx(auVar108,auVar113);
                _local_8a0 = auVar113;
                auVar113 = vdpps_avx(auVar113,auVar113,0x7f);
                local_a80._0_16_ = auVar113;
                if (auVar113._0_4_ < 0.0) {
                  local_940._0_16_ = ZEXT416((uint)fVar282);
                  local_a20._0_4_ = fVar279;
                  local_a40._0_4_ = fVar197;
                  auVar231._0_4_ = sqrtf(auVar113._0_4_);
                  auVar231._4_60_ = extraout_var_00;
                  auVar113 = auVar231._0_16_;
                  fVar279 = (float)local_a20._0_4_;
                  auVar108 = local_940._0_16_;
                }
                else {
                  auVar113 = vsqrtss_avx(auVar113,auVar113);
                  local_a40._0_4_ = fVar197;
                  auVar108 = ZEXT416((uint)fVar282);
                }
                fVar197 = auVar108._0_4_;
                auVar114._4_4_ = fVar197;
                auVar114._0_4_ = fVar197;
                auVar114._8_4_ = fVar197;
                auVar114._12_4_ = fVar197;
                auVar4 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                          ZEXT416((uint)((float)local_a40._0_4_ * 4.0)));
                auVar271 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ * 4.0)),auVar108,
                                           auVar108);
                fVar197 = fVar197 * -fVar197 * 0.5;
                fVar213 = auVar4._0_4_ * 0.5;
                fVar214 = auVar271._0_4_ * 0.5;
                fVar279 = fVar279 * 0.5;
                auVar223._0_4_ = (float)local_9f0._0_4_ * fVar279;
                auVar223._4_4_ = (float)local_9f0._4_4_ * fVar279;
                auVar223._8_4_ = fStack_9e8 * fVar279;
                auVar223._12_4_ = fStack_9e4 * fVar279;
                auVar184._4_4_ = fVar214;
                auVar184._0_4_ = fVar214;
                auVar184._8_4_ = fVar214;
                auVar184._12_4_ = fVar214;
                auVar271 = vfmadd213ps_fma(auVar184,local_9d0,auVar223);
                auVar203._4_4_ = fVar213;
                auVar203._0_4_ = fVar213;
                auVar203._8_4_ = fVar213;
                auVar203._12_4_ = fVar213;
                auVar271 = vfmadd213ps_fma(auVar203,local_9e0,auVar271);
                auVar258._4_4_ = fVar197;
                auVar258._0_4_ = fVar197;
                auVar258._8_4_ = fVar197;
                auVar258._12_4_ = fVar197;
                auVar5 = vfmadd213ps_fma(auVar258,local_9c0,auVar271);
                auVar271 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar108,local_920._0_16_)
                ;
                auVar7 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),auVar108);
                auVar270 = ZEXT1664(auVar7);
                auVar108 = vshufps_avx(auVar246,auVar246,0x55);
                auVar185._0_4_ = (float)local_9f0._0_4_ * auVar108._0_4_;
                auVar185._4_4_ = (float)local_9f0._4_4_ * auVar108._4_4_;
                auVar185._8_4_ = fStack_9e8 * auVar108._8_4_;
                auVar185._12_4_ = fStack_9e4 * auVar108._12_4_;
                uVar102 = auVar7._0_4_;
                auVar204._4_4_ = uVar102;
                auVar204._0_4_ = uVar102;
                auVar204._8_4_ = uVar102;
                auVar204._12_4_ = uVar102;
                auVar108 = vfmadd213ps_fma(auVar204,local_9d0,auVar185);
                auVar157._0_4_ = auVar271._0_4_;
                auVar157._4_4_ = auVar157._0_4_;
                auVar157._8_4_ = auVar157._0_4_;
                auVar157._12_4_ = auVar157._0_4_;
                auVar108 = vfmadd213ps_fma(auVar157,local_9e0,auVar108);
                auVar6 = vfmadd231ps_fma(auVar108,local_9c0,auVar114);
                auVar271 = vdpps_avx(auVar5,auVar5,0x7f);
                auVar108 = vblendps_avx(auVar271,_DAT_01f7aa10,0xe);
                auVar4 = vrsqrtss_avx(auVar108,auVar108);
                fVar197 = auVar4._0_4_;
                fVar214 = auVar271._0_4_;
                fVar197 = fVar197 * 1.5 + fVar214 * -0.5 * fVar197 * fVar197 * fVar197;
                auVar4 = vdpps_avx(auVar5,auVar6,0x7f);
                auVar158._0_4_ = auVar6._0_4_ * fVar214;
                auVar158._4_4_ = auVar6._4_4_ * fVar214;
                auVar158._8_4_ = auVar6._8_4_ * fVar214;
                auVar158._12_4_ = auVar6._12_4_ * fVar214;
                fVar213 = auVar4._0_4_;
                auVar224._0_4_ = auVar5._0_4_ * fVar213;
                auVar224._4_4_ = auVar5._4_4_ * fVar213;
                fVar279 = auVar5._8_4_;
                auVar224._8_4_ = fVar279 * fVar213;
                fVar282 = auVar5._12_4_;
                auVar224._12_4_ = fVar282 * fVar213;
                auVar4 = vsubps_avx(auVar158,auVar224);
                auVar108 = vrcpss_avx(auVar108,auVar108);
                auVar6 = vfnmadd213ss_fma(auVar108,auVar271,ZEXT416(0x40000000));
                fVar213 = auVar108._0_4_ * auVar6._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar212 * (float)local_780._0_4_)));
                auVar171 = ZEXT1664(auVar108);
                local_a40._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                local_a40._8_4_ = -fVar279;
                local_a40._12_4_ = -fVar282;
                auVar186._0_4_ = fVar197 * auVar4._0_4_ * fVar213;
                auVar186._4_4_ = fVar197 * auVar4._4_4_ * fVar213;
                auVar186._8_4_ = fVar197 * auVar4._8_4_ * fVar213;
                auVar186._12_4_ = fVar197 * auVar4._12_4_ * fVar213;
                local_8c0._0_4_ = auVar5._0_4_ * fVar197;
                local_8c0._4_4_ = auVar5._4_4_ * fVar197;
                local_8c0._8_4_ = fVar279 * fVar197;
                local_8c0._12_4_ = fVar282 * fVar197;
                local_920._0_16_ = auVar5;
                local_940._0_4_ = auVar108._0_4_;
                if (fVar214 < -fVar214) {
                  local_a20._0_4_ = auVar113._0_4_;
                  local_800._0_16_ = auVar186;
                  auVar270 = ZEXT1664(auVar7);
                  fVar197 = sqrtf(fVar214);
                  auVar171 = ZEXT464((uint)local_940._0_4_);
                  auVar113 = ZEXT416((uint)local_a20._0_4_);
                  auVar186 = local_800._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar271,auVar271);
                  fVar197 = auVar108._0_4_;
                }
                auVar108 = vdpps_avx(_local_8a0,local_8c0._0_16_,0x7f);
                auVar6 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar113,auVar171._0_16_);
                auVar271 = vdpps_avx(local_a40._0_16_,local_8c0._0_16_,0x7f);
                auVar4 = vdpps_avx(_local_8a0,auVar186,0x7f);
                auVar5 = vdpps_avx(local_820._0_16_,local_8c0._0_16_,0x7f);
                auVar113 = vfmadd213ss_fma(ZEXT416((uint)(auVar113._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_960._0_4_ / fVar197)),auVar6)
                ;
                local_a20._0_4_ = auVar113._0_4_;
                fVar197 = auVar271._0_4_ + auVar4._0_4_;
                auVar231 = ZEXT464((uint)fVar197);
                auVar115._0_4_ = auVar108._0_4_ * auVar108._0_4_;
                auVar115._4_4_ = auVar108._4_4_ * auVar108._4_4_;
                auVar115._8_4_ = auVar108._8_4_ * auVar108._8_4_;
                auVar115._12_4_ = auVar108._12_4_ * auVar108._12_4_;
                auVar113 = vdpps_avx(_local_8a0,local_a40._0_16_,0x7f);
                auVar4 = vsubps_avx(local_a80._0_16_,auVar115);
                auVar271 = vrsqrtss_avx(auVar4,auVar4);
                fVar213 = auVar4._0_4_;
                fVar212 = auVar271._0_4_;
                fVar212 = fVar212 * 1.5 + fVar213 * -0.5 * fVar212 * fVar212 * fVar212;
                auVar271 = vdpps_avx(_local_8a0,local_820._0_16_,0x7f);
                local_a40._0_16_ = ZEXT416((uint)fVar197);
                local_8c0._0_16_ = vfnmadd231ss_fma(auVar113,auVar108,ZEXT416((uint)fVar197));
                auVar113 = vfnmadd231ss_fma(auVar271,auVar108,auVar5);
                if (fVar213 < 0.0) {
                  local_800._0_16_ = auVar108;
                  local_860._0_16_ = auVar5;
                  local_700._0_4_ = fVar212;
                  local_720._0_16_ = auVar113;
                  auVar231 = ZEXT464((uint)fVar197);
                  auVar270 = ZEXT1664(auVar270._0_16_);
                  fVar197 = sqrtf(fVar213);
                  auVar171 = ZEXT464((uint)local_940._0_4_);
                  fVar212 = (float)local_700._0_4_;
                  auVar113 = local_720._0_16_;
                  auVar5 = local_860._0_16_;
                  auVar108 = local_800._0_16_;
                }
                else {
                  auVar271 = vsqrtss_avx(auVar4,auVar4);
                  fVar197 = auVar271._0_4_;
                }
                auVar259 = ZEXT1664(local_a80._0_16_);
                auVar261 = ZEXT1664(local_920._0_16_);
                auVar271 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar197 = fVar197 - auVar271._0_4_;
                auVar4 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
                auVar271 = vfmsub213ss_fma(local_8c0._0_16_,ZEXT416((uint)fVar212),auVar4);
                auVar187._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar5._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar5._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar271._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar271._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar271._12_4_ ^ 0x80000000;
                auVar113 = ZEXT416((uint)(auVar113._0_4_ * fVar212));
                auVar271 = vfmsub231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar271._0_4_)),
                                           local_a40._0_16_,auVar113);
                auVar113 = vinsertps_avx(auVar205,auVar113,0x1c);
                uVar102 = auVar271._0_4_;
                auVar206._4_4_ = uVar102;
                auVar206._0_4_ = uVar102;
                auVar206._8_4_ = uVar102;
                auVar206._12_4_ = uVar102;
                auVar113 = vdivps_avx(auVar113,auVar206);
                auVar271 = vinsertps_avx(local_a40._0_16_,auVar187,0x10);
                auVar271 = vdivps_avx(auVar271,auVar206);
                fVar212 = auVar108._0_4_;
                auVar159._0_4_ = fVar212 * auVar113._0_4_ + fVar197 * auVar271._0_4_;
                auVar159._4_4_ = fVar212 * auVar113._4_4_ + fVar197 * auVar271._4_4_;
                auVar159._8_4_ = fVar212 * auVar113._8_4_ + fVar197 * auVar271._8_4_;
                auVar159._12_4_ = fVar212 * auVar113._12_4_ + fVar197 * auVar271._12_4_;
                auVar271 = vsubps_avx(auVar246,auVar159);
                auVar250 = ZEXT1664(auVar271);
                auVar113 = vandps_avx(auVar108,local_840._0_16_);
                if (auVar113._0_4_ < (float)local_a20._0_4_) {
                  auVar108 = vfmadd231ss_fma(ZEXT416((uint)(auVar171._0_4_ + (float)local_a20._0_4_)
                                                    ),local_740._0_16_,ZEXT416(0x36000000));
                  auVar113 = vandps_avx(ZEXT416((uint)fVar197),local_840._0_16_);
                  if (auVar113._0_4_ < auVar108._0_4_) {
                    fVar197 = auVar271._0_4_ + (float)local_7e0._0_4_;
                    bVar90 = 0;
                    bVar89 = 0;
                    if (fVar197 < (ray->org).field_0.m128[3]) goto LAB_01898f1c;
                    fVar212 = ray->tfar;
                    auVar171 = ZEXT3264(local_980);
                    fVar101 = (float)local_aa0._0_4_;
                    fVar127 = (float)local_aa0._4_4_;
                    fVar128 = fStack_a98;
                    fVar129 = fStack_a94;
                    fVar130 = fStack_a90;
                    fVar131 = fStack_a8c;
                    fVar132 = fStack_a88;
                    fVar149 = fStack_a84;
                    if (fVar212 < fVar197) goto LAB_01898f2b;
                    auVar113 = vmovshdup_avx(auVar271);
                    bVar90 = 0;
                    fVar213 = auVar113._0_4_;
                    if ((fVar213 < 0.0) || (1.0 < fVar213)) goto LAB_01898f2b;
                    auVar113 = vrsqrtss_avx(local_a80._0_16_,local_a80._0_16_);
                    fVar214 = auVar113._0_4_;
                    pGVar10 = (context->scene->geometries).items[uVar91].ptr;
                    if ((pGVar10->mask & ray->mask) == 0) {
                      bVar90 = 0;
                      goto LAB_01898f22;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar90 = 1, pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01898f22;
                    fVar214 = fVar214 * 1.5 + local_a80._0_4_ * -0.5 * fVar214 * fVar214 * fVar214;
                    auVar188._0_4_ = fVar214 * (float)local_8a0._0_4_;
                    auVar188._4_4_ = fVar214 * (float)local_8a0._4_4_;
                    auVar188._8_4_ = fVar214 * fStack_898;
                    auVar188._12_4_ = fVar214 * fStack_894;
                    auVar246 = vfmadd213ps_fma(auVar4,auVar188,local_920._0_16_);
                    auVar113 = vshufps_avx(auVar188,auVar188,0xc9);
                    auVar108 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                    auVar189._0_4_ = auVar188._0_4_ * auVar108._0_4_;
                    auVar189._4_4_ = auVar188._4_4_ * auVar108._4_4_;
                    auVar189._8_4_ = auVar188._8_4_ * auVar108._8_4_;
                    auVar189._12_4_ = auVar188._12_4_ * auVar108._12_4_;
                    auVar4 = vfmsub231ps_fma(auVar189,local_920._0_16_,auVar113);
                    auVar113 = vshufps_avx(auVar4,auVar4,0xc9);
                    auVar108 = vshufps_avx(auVar246,auVar246,0xc9);
                    auVar4 = vshufps_avx(auVar4,auVar4,0xd2);
                    auVar116._0_4_ = auVar246._0_4_ * auVar4._0_4_;
                    auVar116._4_4_ = auVar246._4_4_ * auVar4._4_4_;
                    auVar116._8_4_ = auVar246._8_4_ * auVar4._8_4_;
                    auVar116._12_4_ = auVar246._12_4_ * auVar4._12_4_;
                    auVar108 = vfmsub231ps_fma(auVar116,auVar113,auVar108);
                    auVar113 = vshufps_avx(auVar108,auVar108,0xe9);
                    local_900 = vmovlps_avx(auVar113);
                    local_8f8 = auVar108._0_4_;
                    local_8f0 = 0;
                    local_8ec = (undefined4)local_8c8;
                    local_8e4 = context->user->instID[0];
                    local_8e0 = context->user->instPrimID[0];
                    ray->tfar = fVar197;
                    local_aa4 = -1;
                    local_9b0.valid = &local_aa4;
                    local_9b0.geometryUserPtr = pGVar10->userPtr;
                    local_9b0.context = context->user;
                    local_9b0.hit = (RTCHitN *)&local_900;
                    local_9b0.N = 1;
                    local_9b0.ray = (RTCRayN *)ray;
                    local_8f4 = fVar213;
                    local_8e8 = uVar91;
                    if (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01899142:
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar231 = ZEXT1664(auVar231._0_16_);
                        auVar250 = ZEXT1664(auVar250._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar270 = ZEXT1664(auVar270._0_16_);
                        (*p_Var14)(&local_9b0);
                        if (*local_9b0.valid == 0) goto LAB_01899189;
                      }
                      bVar89 = 1;
                    }
                    else {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar250 = ZEXT1664(auVar271);
                      auVar259 = ZEXT1664(local_a80._0_16_);
                      auVar261 = ZEXT1664(local_920._0_16_);
                      auVar270 = ZEXT1664(auVar270._0_16_);
                      (*pGVar10->occlusionFilterN)(&local_9b0);
                      if (*local_9b0.valid != 0) goto LAB_01899142;
LAB_01899189:
                      ray->tfar = fVar212;
                      bVar89 = 0;
                    }
                    goto LAB_01898f1c;
                  }
                }
                bVar100 = uVar96 < 4;
                uVar96 = uVar96 + 1;
              } while (uVar96 != 5);
              bVar100 = false;
              bVar89 = 5;
LAB_01898f1c:
              bVar90 = bVar89;
LAB_01898f22:
              auVar171 = ZEXT3264(local_980);
              fVar101 = (float)local_aa0._0_4_;
              fVar127 = (float)local_aa0._4_4_;
              fVar128 = fStack_a98;
              fVar129 = fStack_a94;
              fVar130 = fStack_a90;
              fVar131 = fStack_a8c;
              fVar132 = fStack_a88;
              fVar149 = fStack_a84;
LAB_01898f2b:
              bVar97 = (bool)(bVar97 | bVar100 & bVar90);
              fVar197 = ray->tfar;
              auVar124._4_4_ = fVar197;
              auVar124._0_4_ = fVar197;
              auVar124._8_4_ = fVar197;
              auVar124._12_4_ = fVar197;
              auVar124._16_4_ = fVar197;
              auVar124._20_4_ = fVar197;
              auVar124._24_4_ = fVar197;
              auVar124._28_4_ = fVar197;
              auVar117 = vcmpps_avx(_local_880,auVar124,2);
              auVar147 = vandps_avx(auVar117,local_6c0);
              auVar117 = local_6c0 & auVar117;
              local_6c0 = auVar147;
            } while ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar117 >> 0x7f,0) != '\0') ||
                       (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar117 >> 0xbf,0) != '\0') ||
                     (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar117[0x1f] < '\0');
          }
          auVar170._0_4_ = fVar101 + local_4c0._0_4_;
          auVar170._4_4_ = fVar127 + local_4c0._4_4_;
          auVar170._8_4_ = fVar128 + local_4c0._8_4_;
          auVar170._12_4_ = fVar129 + local_4c0._12_4_;
          auVar170._16_4_ = fVar130 + local_4c0._16_4_;
          auVar170._20_4_ = fVar131 + local_4c0._20_4_;
          auVar170._24_4_ = fVar132 + local_4c0._24_4_;
          auVar170._28_4_ = fVar149 + local_4c0._28_4_;
          auVar117 = vcmpps_avx(auVar170,auVar124,2);
          auVar147 = vandps_avx(local_5a0,local_580);
          auVar147 = vandps_avx(auVar117,auVar147);
          auVar196._0_4_ = fVar101 + local_500._0_4_;
          auVar196._4_4_ = fVar127 + local_500._4_4_;
          auVar196._8_4_ = fVar128 + local_500._8_4_;
          auVar196._12_4_ = fVar129 + local_500._12_4_;
          auVar196._16_4_ = fVar130 + local_500._16_4_;
          auVar196._20_4_ = fVar131 + local_500._20_4_;
          auVar196._24_4_ = fVar132 + local_500._24_4_;
          auVar196._28_4_ = fVar149 + local_500._28_4_;
          auVar278 = vcmpps_avx(auVar196,auVar124,2);
          auVar117 = vandps_avx(_local_760,local_a60);
          auVar117 = vandps_avx(auVar278,auVar117);
          auVar117 = vorps_avx(auVar147,auVar117);
          if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0x7f,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar117 >> 0xbf,0) != '\0') ||
              (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar117[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar117;
            auVar147 = vblendvps_avx(local_500,local_4c0,auVar147);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar147;
            uVar133 = vmovlps_avx(local_510);
            (&uStack_140)[uVar99 * 0xc] = uVar133;
            aiStack_138[uVar99 * 0x18] = local_ae4 + 1;
            iVar98 = iVar98 + 1;
          }
        }
      }
    }
    fVar197 = ray->tfar;
    auVar121._4_4_ = fVar197;
    auVar121._0_4_ = fVar197;
    auVar121._8_4_ = fVar197;
    auVar121._12_4_ = fVar197;
    auVar121._16_4_ = fVar197;
    auVar121._20_4_ = fVar197;
    auVar121._24_4_ = fVar197;
    auVar121._28_4_ = fVar197;
    if (iVar98 == 0) break;
    uVar93 = -iVar98;
    pauVar92 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar98 - 1) * 0x60);
    while( true ) {
      auVar147 = pauVar92[1];
      auVar143._0_4_ = fVar101 + auVar147._0_4_;
      auVar143._4_4_ = fVar127 + auVar147._4_4_;
      auVar143._8_4_ = fVar128 + auVar147._8_4_;
      auVar143._12_4_ = fVar129 + auVar147._12_4_;
      auVar143._16_4_ = fVar130 + auVar147._16_4_;
      auVar143._20_4_ = fVar131 + auVar147._20_4_;
      auVar143._24_4_ = fVar132 + auVar147._24_4_;
      auVar143._28_4_ = fVar149 + auVar147._28_4_;
      auVar278 = vcmpps_avx(auVar143,auVar121,2);
      auVar117 = vandps_avx(auVar278,*pauVar92);
      local_4c0 = auVar117;
      auVar278 = *pauVar92 & auVar278;
      if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar278 >> 0x7f,0) != '\0') ||
            (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar278 >> 0xbf,0) != '\0') ||
          (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar278[0x1f] < '\0') break;
      pauVar92 = pauVar92 + -3;
      uVar93 = uVar93 + 1;
      if (uVar93 == 0) goto LAB_01899305;
    }
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    auVar147 = vblendvps_avx(auVar122,auVar147,auVar117);
    auVar278 = vshufps_avx(auVar147,auVar147,0xb1);
    auVar278 = vminps_avx(auVar147,auVar278);
    auVar266 = vshufpd_avx(auVar278,auVar278,5);
    auVar278 = vminps_avx(auVar278,auVar266);
    auVar266 = vpermpd_avx2(auVar278,0x4e);
    auVar278 = vminps_avx(auVar278,auVar266);
    auVar147 = vcmpps_avx(auVar147,auVar278,0);
    auVar278 = auVar117 & auVar147;
    if ((((((((auVar278 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar278 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar278 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar278 >> 0x7f,0) != '\0') ||
          (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar278 >> 0xbf,0) != '\0') ||
        (auVar278 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar278[0x1f] < '\0') {
      auVar117 = vandps_avx(auVar147,auVar117);
    }
    uVar96 = *(ulong *)pauVar92[2];
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar96;
    uVar94 = vmovmskps_avx(auVar117);
    iVar98 = 0;
    for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
      iVar98 = iVar98 + 1;
    }
    *(undefined4 *)(local_4c0 + (uint)(iVar98 << 2)) = 0;
    uVar94 = ~uVar93;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar94 = -uVar93;
    }
    uVar99 = (ulong)uVar94;
    local_ae4 = *(int *)(pauVar92[2] + 8);
    *pauVar92 = local_4c0;
    uVar102 = (undefined4)uVar96;
    auVar144._4_4_ = uVar102;
    auVar144._0_4_ = uVar102;
    auVar144._8_4_ = uVar102;
    auVar144._12_4_ = uVar102;
    auVar144._16_4_ = uVar102;
    auVar144._20_4_ = uVar102;
    auVar144._24_4_ = uVar102;
    auVar144._28_4_ = uVar102;
    auVar113 = vmovshdup_avx(auVar106);
    auVar113 = vsubps_avx(auVar113,auVar106);
    auVar123._0_4_ = auVar113._0_4_;
    auVar123._4_4_ = auVar123._0_4_;
    auVar123._8_4_ = auVar123._0_4_;
    auVar123._12_4_ = auVar123._0_4_;
    auVar123._16_4_ = auVar123._0_4_;
    auVar123._20_4_ = auVar123._0_4_;
    auVar123._24_4_ = auVar123._0_4_;
    auVar123._28_4_ = auVar123._0_4_;
    auVar113 = vfmadd132ps_fma(auVar123,auVar144,_DAT_01faff20);
    local_500 = ZEXT1632(auVar113);
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (uint)(iVar98 << 2));
  } while( true );
LAB_01899305:
  if (bVar97 != false) {
    return bVar97;
  }
  auVar147 = vcmpps_avx(local_2e0,auVar121,2);
  uVar91 = vmovmskps_avx(auVar147);
  uVar91 = uVar91 & (uint)local_7c8 - 1 & (uint)local_7c8;
  if (uVar91 == 0) {
    return false;
  }
  goto LAB_01896d20;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }